

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar61;
  int iVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  byte bVar67;
  byte bVar68;
  ulong uVar69;
  byte bVar70;
  ulong uVar71;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined8 in_R10;
  long lVar72;
  bool bVar73;
  ulong uVar74;
  uint uVar75;
  uint uVar133;
  uint uVar134;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  uint uVar135;
  uint uVar139;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float pp;
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar155;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar156 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar172;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar189;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar210;
  float fVar211;
  undefined1 auVar206 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [32];
  undefined1 auVar220 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  float fVar227;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar226 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  float fVar235;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar242;
  undefined1 auVar238 [32];
  float fVar240;
  float fVar241;
  undefined1 auVar239 [64];
  float fVar243;
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  float s;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_a64;
  undefined1 local_8c0 [16];
  uint local_8b0;
  uint local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  RTCHitN local_540 [16];
  undefined1 auStack_530 [16];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  uint local_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  uint uStack_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar74 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar83 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar218 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  fVar188 = fVar1 * auVar218._0_4_;
  fVar140 = fVar1 * auVar83._0_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar90 = vpmovsxbd_avx2(auVar78);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar88 = vpmovsxbd_avx2(auVar79);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar76);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar92 = vpmovsxbd_avx2(auVar80);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar74 * 0xc + 6);
  auVar93 = vpmovsxbd_avx2(auVar81);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar74 * 0xd + 6);
  auVar91 = vpmovsxbd_avx2(auVar77);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar74 * 0x12 + 6);
  auVar94 = vpmovsxbd_avx2(auVar82);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar74 * 0x13 + 6);
  auVar95 = vpmovsxbd_avx2(auVar2);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar74 * 0x14 + 6);
  auVar97 = vpmovsxbd_avx2(auVar3);
  auVar96 = vcvtdq2ps_avx(auVar97);
  auVar105._4_4_ = fVar140;
  auVar105._0_4_ = fVar140;
  auVar105._8_4_ = fVar140;
  auVar105._12_4_ = fVar140;
  auVar105._16_4_ = fVar140;
  auVar105._20_4_ = fVar140;
  auVar105._24_4_ = fVar140;
  auVar105._28_4_ = fVar140;
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  auVar87 = ZEXT1632(CONCAT412(fVar1 * auVar83._12_4_,
                               CONCAT48(fVar1 * auVar83._8_4_,
                                        CONCAT44(fVar1 * auVar83._4_4_,fVar140))));
  auVar86 = vpermps_avx2(auVar107,auVar87);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar85 = vpermps_avx512vl(auVar84,auVar87);
  fVar140 = auVar85._0_4_;
  auVar223._0_4_ = fVar140 * auVar89._0_4_;
  fVar189 = auVar85._4_4_;
  auVar223._4_4_ = fVar189 * auVar89._4_4_;
  fVar207 = auVar85._8_4_;
  auVar223._8_4_ = fVar207 * auVar89._8_4_;
  fVar208 = auVar85._12_4_;
  auVar223._12_4_ = fVar208 * auVar89._12_4_;
  fVar209 = auVar85._16_4_;
  auVar223._16_4_ = fVar209 * auVar89._16_4_;
  fVar210 = auVar85._20_4_;
  auVar223._20_4_ = fVar210 * auVar89._20_4_;
  fVar211 = auVar85._24_4_;
  auVar223._28_36_ = in_ZMM4._28_36_;
  auVar223._24_4_ = fVar211 * auVar89._24_4_;
  auVar87._4_4_ = auVar91._4_4_ * fVar189;
  auVar87._0_4_ = auVar91._0_4_ * fVar140;
  auVar87._8_4_ = auVar91._8_4_ * fVar207;
  auVar87._12_4_ = auVar91._12_4_ * fVar208;
  auVar87._16_4_ = auVar91._16_4_ * fVar209;
  auVar87._20_4_ = auVar91._20_4_ * fVar210;
  auVar87._24_4_ = auVar91._24_4_ * fVar211;
  auVar87._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar96._4_4_ * fVar189;
  auVar97._0_4_ = auVar96._0_4_ * fVar140;
  auVar97._8_4_ = auVar96._8_4_ * fVar207;
  auVar97._12_4_ = auVar96._12_4_ * fVar208;
  auVar97._16_4_ = auVar96._16_4_ * fVar209;
  auVar97._20_4_ = auVar96._20_4_ * fVar210;
  auVar97._24_4_ = auVar96._24_4_ * fVar211;
  auVar97._28_4_ = auVar85._28_4_;
  auVar78 = vfmadd231ps_fma(auVar223._0_32_,auVar86,auVar88);
  auVar79 = vfmadd231ps_fma(auVar87,auVar86,auVar93);
  auVar76 = vfmadd231ps_fma(auVar97,auVar95,auVar86);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar105,auVar90);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar105,auVar92);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar94,auVar105);
  auVar106._4_4_ = fVar188;
  auVar106._0_4_ = fVar188;
  auVar106._8_4_ = fVar188;
  auVar106._12_4_ = fVar188;
  auVar106._16_4_ = fVar188;
  auVar106._20_4_ = fVar188;
  auVar106._24_4_ = fVar188;
  auVar106._28_4_ = fVar188;
  auVar86 = ZEXT1632(CONCAT412(fVar1 * auVar218._12_4_,
                               CONCAT48(fVar1 * auVar218._8_4_,
                                        CONCAT44(fVar1 * auVar218._4_4_,fVar188))));
  auVar97 = vpermps_avx2(auVar107,auVar86);
  auVar86 = vpermps_avx512vl(auVar84,auVar86);
  auVar87 = vmulps_avx512vl(auVar86,auVar89);
  auVar99._0_4_ = auVar86._0_4_ * auVar91._0_4_;
  auVar99._4_4_ = auVar86._4_4_ * auVar91._4_4_;
  auVar99._8_4_ = auVar86._8_4_ * auVar91._8_4_;
  auVar99._12_4_ = auVar86._12_4_ * auVar91._12_4_;
  auVar99._16_4_ = auVar86._16_4_ * auVar91._16_4_;
  auVar99._20_4_ = auVar86._20_4_ * auVar91._20_4_;
  auVar99._24_4_ = auVar86._24_4_ * auVar91._24_4_;
  auVar99._28_4_ = 0;
  auVar91._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar91._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar91._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar91._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar91._16_4_ = auVar86._16_4_ * auVar96._16_4_;
  auVar91._20_4_ = auVar86._20_4_ * auVar96._20_4_;
  auVar91._24_4_ = auVar86._24_4_ * auVar96._24_4_;
  auVar91._28_4_ = auVar89._28_4_;
  auVar88 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar88);
  auVar80 = vfmadd231ps_fma(auVar99,auVar97,auVar93);
  auVar81 = vfmadd231ps_fma(auVar91,auVar97,auVar95);
  auVar88 = vfmadd231ps_avx512vl(auVar88,auVar106,auVar90);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar106,auVar92);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar106,auVar94);
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  auVar90 = vandps_avx(ZEXT1632(auVar78),auVar101);
  auVar103._8_4_ = 0x219392ef;
  auVar103._0_8_ = 0x219392ef219392ef;
  auVar103._12_4_ = 0x219392ef;
  auVar103._16_4_ = 0x219392ef;
  auVar103._20_4_ = 0x219392ef;
  auVar103._24_4_ = 0x219392ef;
  auVar103._28_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar90,auVar103,1);
  bVar73 = (bool)((byte)uVar69 & 1);
  auVar86._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar78._0_4_;
  bVar73 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar78._4_4_;
  bVar73 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar78._8_4_;
  bVar73 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar78._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar90 = vandps_avx(ZEXT1632(auVar79),auVar101);
  uVar69 = vcmpps_avx512vl(auVar90,auVar103,1);
  bVar73 = (bool)((byte)uVar69 & 1);
  auVar84._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar79._0_4_;
  bVar73 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar79._4_4_;
  bVar73 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar79._8_4_;
  bVar73 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar79._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar90 = vandps_avx(ZEXT1632(auVar76),auVar101);
  uVar69 = vcmpps_avx512vl(auVar90,auVar103,1);
  bVar73 = (bool)((byte)uVar69 & 1);
  auVar90._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar76._0_4_;
  bVar73 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar76._4_4_;
  bVar73 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar76._8_4_;
  bVar73 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar76._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar89 = vrcp14ps_avx512vl(auVar86);
  auVar102._8_4_ = 0x3f800000;
  auVar102._0_8_ = 0x3f8000003f800000;
  auVar102._12_4_ = 0x3f800000;
  auVar102._16_4_ = 0x3f800000;
  auVar102._20_4_ = 0x3f800000;
  auVar102._24_4_ = 0x3f800000;
  auVar102._28_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar86,auVar89,auVar102);
  auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar84);
  auVar79 = vfnmadd213ps_fma(auVar84,auVar89,auVar102);
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar90);
  auVar76 = vfnmadd213ps_fma(auVar90,auVar89,auVar102);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar89,auVar89);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx512vl(auVar90,auVar88);
  auVar94._4_4_ = auVar78._4_4_ * auVar90._4_4_;
  auVar94._0_4_ = auVar78._0_4_ * auVar90._0_4_;
  auVar94._8_4_ = auVar78._8_4_ * auVar90._8_4_;
  auVar94._12_4_ = auVar78._12_4_ * auVar90._12_4_;
  auVar94._16_4_ = auVar90._16_4_ * 0.0;
  auVar94._20_4_ = auVar90._20_4_ * 0.0;
  auVar94._24_4_ = auVar90._24_4_ * 0.0;
  auVar94._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx512vl(auVar90,auVar88);
  auVar100._0_4_ = auVar78._0_4_ * auVar90._0_4_;
  auVar100._4_4_ = auVar78._4_4_ * auVar90._4_4_;
  auVar100._8_4_ = auVar78._8_4_ * auVar90._8_4_;
  auVar100._12_4_ = auVar78._12_4_ * auVar90._12_4_;
  auVar100._16_4_ = auVar90._16_4_ * 0.0;
  auVar100._20_4_ = auVar90._20_4_ * 0.0;
  auVar100._24_4_ = auVar90._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0xe + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar80));
  auVar91 = vpbroadcastd_avx512vl();
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar95._4_4_ = auVar79._4_4_ * auVar90._4_4_;
  auVar95._0_4_ = auVar79._0_4_ * auVar90._0_4_;
  auVar95._8_4_ = auVar79._8_4_ * auVar90._8_4_;
  auVar95._12_4_ = auVar79._12_4_ * auVar90._12_4_;
  auVar95._16_4_ = auVar90._16_4_ * 0.0;
  auVar95._20_4_ = auVar90._20_4_ * 0.0;
  auVar95._24_4_ = auVar90._24_4_ * 0.0;
  auVar95._28_4_ = auVar90._28_4_;
  auVar90 = vcvtdq2ps_avx(auVar88);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar80));
  auVar98._0_4_ = auVar79._0_4_ * auVar90._0_4_;
  auVar98._4_4_ = auVar79._4_4_ * auVar90._4_4_;
  auVar98._8_4_ = auVar79._8_4_ * auVar90._8_4_;
  auVar98._12_4_ = auVar79._12_4_ * auVar90._12_4_;
  auVar98._16_4_ = auVar90._16_4_ * 0.0;
  auVar98._20_4_ = auVar90._20_4_ * 0.0;
  auVar98._24_4_ = auVar90._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x15 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar81));
  auVar96._4_4_ = auVar90._4_4_ * auVar76._4_4_;
  auVar96._0_4_ = auVar90._0_4_ * auVar76._0_4_;
  auVar96._8_4_ = auVar90._8_4_ * auVar76._8_4_;
  auVar96._12_4_ = auVar90._12_4_ * auVar76._12_4_;
  auVar96._16_4_ = auVar90._16_4_ * 0.0;
  auVar96._20_4_ = auVar90._20_4_ * 0.0;
  auVar96._24_4_ = auVar90._24_4_ * 0.0;
  auVar96._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x17 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar81));
  auVar85._0_4_ = auVar76._0_4_ * auVar90._0_4_;
  auVar85._4_4_ = auVar76._4_4_ * auVar90._4_4_;
  auVar85._8_4_ = auVar76._8_4_ * auVar90._8_4_;
  auVar85._12_4_ = auVar76._12_4_ * auVar90._12_4_;
  auVar85._16_4_ = auVar90._16_4_ * 0.0;
  auVar85._20_4_ = auVar90._20_4_ * 0.0;
  auVar85._24_4_ = auVar90._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar90 = vpminsd_avx2(auVar94,auVar100);
  auVar88 = vpminsd_avx2(auVar95,auVar98);
  auVar90 = vmaxps_avx(auVar90,auVar88);
  auVar88 = vpminsd_avx2(auVar96,auVar85);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar89._4_4_ = uVar155;
  auVar89._0_4_ = uVar155;
  auVar89._8_4_ = uVar155;
  auVar89._12_4_ = uVar155;
  auVar89._16_4_ = uVar155;
  auVar89._20_4_ = uVar155;
  auVar89._24_4_ = uVar155;
  auVar89._28_4_ = uVar155;
  auVar88 = vmaxps_avx512vl(auVar88,auVar89);
  auVar90 = vmaxps_avx(auVar90,auVar88);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  auVar88._16_4_ = 0x3f7ffffa;
  auVar88._20_4_ = 0x3f7ffffa;
  auVar88._24_4_ = 0x3f7ffffa;
  auVar88._28_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar90,auVar88);
  auVar90 = vpmaxsd_avx2(auVar94,auVar100);
  auVar88 = vpmaxsd_avx2(auVar95,auVar98);
  auVar90 = vminps_avx(auVar90,auVar88);
  auVar88 = vpmaxsd_avx2(auVar96,auVar85);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar92._4_4_ = uVar155;
  auVar92._0_4_ = uVar155;
  auVar92._8_4_ = uVar155;
  auVar92._12_4_ = uVar155;
  auVar92._16_4_ = uVar155;
  auVar92._20_4_ = uVar155;
  auVar92._24_4_ = uVar155;
  auVar92._28_4_ = uVar155;
  auVar88 = vminps_avx512vl(auVar88,auVar92);
  auVar90 = vminps_avx(auVar90,auVar88);
  auVar93._8_4_ = 0x3f800003;
  auVar93._0_8_ = 0x3f8000033f800003;
  auVar93._12_4_ = 0x3f800003;
  auVar93._16_4_ = 0x3f800003;
  auVar93._20_4_ = 0x3f800003;
  auVar93._24_4_ = 0x3f800003;
  auVar93._28_4_ = 0x3f800003;
  auVar90 = vmulps_avx512vl(auVar90,auVar93);
  uVar16 = vcmpps_avx512vl(local_340,auVar90,2);
  uVar18 = vpcmpgtd_avx512vl(auVar91,_DAT_01fb4ba0);
  local_788 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar18));
  local_570 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_790 = prim;
LAB_01a3ce02:
  if (local_788 == 0) {
    return;
  }
  lVar72 = 0;
  for (uVar69 = local_788; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    lVar72 = lVar72 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar72 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar4].ptr;
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar5);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar72 = *(long *)&pGVar7[1].time_range.upper;
  auVar78 = *(undefined1 (*) [16])(lVar72 + (long)p_Var8 * uVar69);
  auVar79 = *(undefined1 (*) [16])(lVar72 + (uVar69 + 1) * (long)p_Var8);
  local_788 = local_788 - 1 & local_788;
  if (local_788 != 0) {
    uVar71 = local_788 - 1 & local_788;
    for (uVar74 = local_788; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    }
    if (uVar71 != 0) {
      for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar80 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar246._4_4_ = uVar155;
  auVar246._0_4_ = uVar155;
  auVar246._8_4_ = uVar155;
  auVar246._12_4_ = uVar155;
  local_4a0._16_4_ = uVar155;
  local_4a0._0_16_ = auVar246;
  local_4a0._20_4_ = uVar155;
  local_4a0._24_4_ = uVar155;
  local_4a0._28_4_ = uVar155;
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar250._4_4_ = uVar155;
  auVar250._0_4_ = uVar155;
  auVar250._8_4_ = uVar155;
  auVar250._12_4_ = uVar155;
  local_3c0._16_4_ = uVar155;
  local_3c0._0_16_ = auVar250;
  local_3c0._20_4_ = uVar155;
  local_3c0._24_4_ = uVar155;
  local_3c0._28_4_ = uVar155;
  auVar76 = vunpcklps_avx(auVar246,auVar250);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar252 = ZEXT3264(auVar90);
  auVar82 = auVar90._0_16_;
  local_730 = vinsertps_avx512f(auVar76,auVar82,0x28);
  auVar218._0_4_ = auVar78._0_4_ + auVar79._0_4_;
  auVar218._4_4_ = auVar78._4_4_ + auVar79._4_4_;
  auVar218._8_4_ = auVar78._8_4_ + auVar79._8_4_;
  auVar218._12_4_ = auVar78._12_4_ + auVar79._12_4_;
  auVar83._8_4_ = 0x3f000000;
  auVar83._0_8_ = 0x3f0000003f000000;
  auVar83._12_4_ = 0x3f000000;
  auVar76 = vmulps_avx512vl(auVar218,auVar83);
  auVar76 = vsubps_avx(auVar76,auVar80);
  auVar76 = vdpps_avx(auVar76,local_730,0x7f);
  local_740 = vdpps_avx(local_730,local_730,0x7f);
  auVar244 = ZEXT1664(local_740);
  fVar1 = *(float *)(ray + k * 4 + 0x30);
  auVar245 = ZEXT464((uint)fVar1);
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = local_740._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar224);
  auVar81 = vfnmadd213ss_fma(auVar77,local_740,ZEXT416(0x40000000));
  local_320 = auVar76._0_4_ * auVar77._0_4_ * auVar81._0_4_;
  auVar225._4_4_ = local_320;
  auVar225._0_4_ = local_320;
  auVar225._8_4_ = local_320;
  auVar225._12_4_ = local_320;
  fStack_450 = local_320;
  _local_460 = auVar225;
  fStack_44c = local_320;
  fStack_448 = local_320;
  fStack_444 = local_320;
  auVar76 = vfmadd231ps_fma(auVar80,local_730,auVar225);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar78 = vsubps_avx(auVar78,auVar76);
  auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar72 + (uVar69 + 2) * (long)p_Var8),auVar76);
  auVar234 = ZEXT1664(auVar80);
  auVar79 = vsubps_avx(auVar79,auVar76);
  auVar239 = ZEXT1664(auVar79);
  auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar72 + (uVar69 + 3) * (long)p_Var8),auVar76);
  auVar90 = vbroadcastss_avx512vl(auVar78);
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  local_6c0 = ZEXT1632(auVar78);
  auVar88 = vpermps_avx512vl(auVar109,local_6c0);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  auVar89 = vpermps_avx512vl(auVar110,local_6c0);
  auVar111._8_4_ = 3;
  auVar111._0_8_ = 0x300000003;
  auVar111._12_4_ = 3;
  auVar111._16_4_ = 3;
  auVar111._20_4_ = 3;
  auVar111._24_4_ = 3;
  auVar111._28_4_ = 3;
  auVar92 = vpermps_avx512vl(auVar111,local_6c0);
  auVar93 = vbroadcastss_avx512vl(auVar79);
  local_700 = ZEXT1632(auVar79);
  auVar91 = vpermps_avx512vl(auVar109,local_700);
  auVar94 = vpermps_avx512vl(auVar110,local_700);
  auVar95 = vpermps_avx512vl(auVar111,local_700);
  auVar96 = vbroadcastss_avx512vl(auVar80);
  local_6e0 = ZEXT1632(auVar80);
  local_8a0 = vpermps_avx512vl(auVar109,local_6e0);
  auVar253 = ZEXT3264(local_8a0);
  local_2a0 = vpermps_avx512vl(auVar110,local_6e0);
  local_220 = vpermps_avx2(auVar111,local_6e0);
  local_2c0 = auVar76._0_4_;
  _local_720 = ZEXT1632(auVar76);
  local_240 = vpermps_avx2(auVar109,_local_720);
  local_2e0 = vpermps_avx512vl(auVar110,_local_720);
  local_300 = vpermps_avx2(auVar111,_local_720);
  local_280._16_16_ = local_2e0._16_16_;
  local_280._0_16_ = vmulss_avx512f(auVar82,auVar82);
  auVar78 = vfmadd231ps_fma(ZEXT1632(local_280._0_16_),local_3c0,local_3c0);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_4a0,local_4a0);
  local_260._0_4_ = auVar78._0_4_;
  local_260._4_4_ = local_260._0_4_;
  local_260._8_4_ = local_260._0_4_;
  local_260._12_4_ = local_260._0_4_;
  local_260._16_4_ = local_260._0_4_;
  local_260._20_4_ = local_260._0_4_;
  local_260._24_4_ = local_260._0_4_;
  local_260._28_4_ = local_260._0_4_;
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_260,auVar108);
  local_670 = ZEXT416((uint)local_320);
  local_320 = fVar1 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_550 = vpbroadcastd_avx512vl();
  uVar69 = 0;
  local_a64 = 1;
  local_560 = vpbroadcastd_avx512vl();
  auVar78 = vsqrtss_avx(local_740,local_740);
  local_8a4 = auVar78._0_4_;
  auVar78 = vsqrtss_avx(local_740,local_740);
  local_8a8 = auVar78._0_4_;
  local_3f0 = ZEXT816(0x3f80000000000000);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar254 = ZEXT3264(auVar97);
  auVar223 = ZEXT3264(_DAT_01f7b040);
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  do {
    auVar78 = vmovshdup_avx(local_3f0);
    auVar78 = vsubps_avx(auVar78,local_3f0);
    local_860._0_4_ = auVar78._0_4_;
    fVar140 = local_860._0_4_ * 0.04761905;
    uVar155 = local_3f0._0_4_;
    local_840._4_4_ = uVar155;
    local_840._0_4_ = uVar155;
    local_840._8_4_ = uVar155;
    local_840._12_4_ = uVar155;
    local_840._16_4_ = uVar155;
    local_840._20_4_ = uVar155;
    local_840._24_4_ = uVar155;
    local_840._28_4_ = uVar155;
    local_860._4_4_ = local_860._0_4_;
    local_860._8_4_ = local_860._0_4_;
    local_860._12_4_ = local_860._0_4_;
    local_860._16_4_ = local_860._0_4_;
    local_860._20_4_ = local_860._0_4_;
    local_860._24_4_ = local_860._0_4_;
    local_860._28_4_ = local_860._0_4_;
    auVar78 = vfmadd231ps_fma(local_840,local_860,auVar223._0_32_);
    auVar97 = vsubps_avx512vl(auVar254._0_32_,ZEXT1632(auVar78));
    fVar189 = auVar78._0_4_;
    fVar207 = auVar78._4_4_;
    fVar208 = auVar78._8_4_;
    fVar209 = auVar78._12_4_;
    fVar211 = auVar97._0_4_;
    fVar188 = auVar97._4_4_;
    fVar227 = auVar97._8_4_;
    fVar228 = auVar97._12_4_;
    fVar172 = auVar97._16_4_;
    fVar229 = auVar97._20_4_;
    fVar230 = auVar97._24_4_;
    auVar104._4_4_ = fVar188 * fVar188 * -fVar207;
    auVar104._0_4_ = fVar211 * fVar211 * -fVar189;
    auVar104._8_4_ = fVar227 * fVar227 * -fVar208;
    auVar104._12_4_ = fVar228 * fVar228 * -fVar209;
    auVar104._16_4_ = fVar172 * fVar172 * -0.0;
    auVar104._20_4_ = fVar229 * fVar229 * -0.0;
    auVar104._24_4_ = fVar230 * fVar230 * -0.0;
    auVar104._28_4_ = 0x80000000;
    auVar234._0_28_ =
         ZEXT1628(CONCAT412(fVar209 * fVar209,
                            CONCAT48(fVar208 * fVar208,CONCAT44(fVar207 * fVar207,fVar189 * fVar189)
                                    )));
    fVar235 = fVar189 * 3.0;
    fVar240 = fVar207 * 3.0;
    fVar241 = fVar208 * 3.0;
    fVar242 = fVar209 * 3.0;
    auVar254._28_36_ = auVar239._28_36_;
    auVar254._0_28_ = ZEXT1628(CONCAT412(fVar242,CONCAT48(fVar241,CONCAT44(fVar240,fVar235))));
    fVar243 = auVar239._28_4_ + -5.0;
    auVar167._0_4_ = (fVar235 + -5.0) * fVar189 * fVar189 + 2.0;
    auVar167._4_4_ = (fVar240 + -5.0) * fVar207 * fVar207 + 2.0;
    auVar167._8_4_ = (fVar241 + -5.0) * fVar208 * fVar208 + 2.0;
    auVar167._12_4_ = (fVar242 + -5.0) * fVar209 * fVar209 + 2.0;
    auVar167._16_4_ = 0x40000000;
    auVar167._20_4_ = 0x40000000;
    auVar167._24_4_ = 0x40000000;
    auVar167._28_4_ = 0x40000000;
    auVar239._0_4_ = fVar211 * fVar211;
    auVar239._4_4_ = fVar188 * fVar188;
    auVar239._8_4_ = fVar227 * fVar227;
    auVar239._12_4_ = fVar228 * fVar228;
    auVar239._16_4_ = fVar172 * fVar172;
    auVar239._20_4_ = fVar229 * fVar229;
    auVar239._28_36_ = auVar244._28_36_;
    auVar239._24_4_ = fVar230 * fVar230;
    auVar185._0_4_ = auVar239._0_4_ * (fVar211 * 3.0 + -5.0) + 2.0;
    auVar185._4_4_ = auVar239._4_4_ * (fVar188 * 3.0 + -5.0) + 2.0;
    auVar185._8_4_ = auVar239._8_4_ * (fVar227 * 3.0 + -5.0) + 2.0;
    auVar185._12_4_ = auVar239._12_4_ * (fVar228 * 3.0 + -5.0) + 2.0;
    auVar185._16_4_ = auVar239._16_4_ * (fVar172 * 3.0 + -5.0) + 2.0;
    auVar185._20_4_ = auVar239._20_4_ * (fVar229 * 3.0 + -5.0) + 2.0;
    auVar185._24_4_ = auVar239._24_4_ * (fVar230 * 3.0 + -5.0) + 2.0;
    auVar185._28_4_ = auVar245._28_4_ + -5.0 + 2.0;
    fVar210 = auVar97._28_4_;
    auVar120._4_4_ = fVar207 * fVar207 * -fVar188;
    auVar120._0_4_ = fVar189 * fVar189 * -fVar211;
    auVar120._8_4_ = fVar208 * fVar208 * -fVar227;
    auVar120._12_4_ = fVar209 * fVar209 * -fVar228;
    auVar120._16_4_ = -fVar172 * 0.0 * 0.0;
    auVar120._20_4_ = -fVar229 * 0.0 * 0.0;
    auVar120._24_4_ = -fVar230 * 0.0 * 0.0;
    auVar120._28_4_ = -fVar210;
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar97 = vmulps_avx512vl(auVar104,auVar84);
    auVar85 = vmulps_avx512vl(auVar167,auVar84);
    auVar86 = vmulps_avx512vl(auVar185,auVar84);
    auVar87 = vmulps_avx512vl(auVar120,auVar84);
    auVar121._4_4_ = fStack_2bc * auVar87._4_4_;
    auVar121._0_4_ = local_2c0 * auVar87._0_4_;
    auVar121._8_4_ = fStack_2b8 * auVar87._8_4_;
    auVar121._12_4_ = fStack_2b4 * auVar87._12_4_;
    auVar121._16_4_ = fStack_2b0 * auVar87._16_4_;
    auVar121._20_4_ = fStack_2ac * auVar87._20_4_;
    auVar121._24_4_ = fStack_2a8 * auVar87._24_4_;
    auVar121._28_4_ = auVar185._28_4_;
    auVar98 = vmulps_avx512vl(local_240,auVar87);
    auVar99 = vmulps_avx512vl(local_2e0,auVar87);
    auVar35._4_4_ = local_300._4_4_ * auVar87._4_4_;
    auVar35._0_4_ = local_300._0_4_ * auVar87._0_4_;
    auVar35._8_4_ = local_300._8_4_ * auVar87._8_4_;
    auVar35._12_4_ = local_300._12_4_ * auVar87._12_4_;
    auVar35._16_4_ = local_300._16_4_ * auVar87._16_4_;
    auVar35._20_4_ = local_300._20_4_ * auVar87._20_4_;
    auVar35._24_4_ = local_300._24_4_ * auVar87._24_4_;
    auVar35._28_4_ = auVar87._28_4_;
    auVar87 = vfmadd231ps_avx512vl(auVar121,auVar86,auVar96);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar86,auVar253._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar86,local_2a0);
    auVar86 = vfmadd231ps_avx512vl(auVar35,local_220,auVar86);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar93);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar85,auVar91);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar85,auVar94);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar95,auVar85);
    auVar100 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar90);
    auVar101 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar88);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar89);
    auVar98 = vfmadd231ps_avx512vl(auVar86,auVar92,auVar97);
    auVar36._4_4_ = (fVar188 + fVar188) * fVar207;
    auVar36._0_4_ = (fVar211 + fVar211) * fVar189;
    auVar36._8_4_ = (fVar227 + fVar227) * fVar208;
    auVar36._12_4_ = (fVar228 + fVar228) * fVar209;
    auVar36._16_4_ = (fVar172 + fVar172) * 0.0;
    auVar36._20_4_ = (fVar229 + fVar229) * 0.0;
    auVar36._24_4_ = (fVar230 + fVar230) * 0.0;
    auVar36._28_4_ = auVar85._28_4_;
    auVar97 = vsubps_avx(auVar36,auVar239._0_32_);
    auVar216._0_28_ =
         ZEXT1628(CONCAT412((fVar209 + fVar209) * (fVar242 + -5.0) + fVar242 * fVar209,
                            CONCAT48((fVar208 + fVar208) * (fVar241 + -5.0) + fVar241 * fVar208,
                                     CONCAT44((fVar207 + fVar207) * (fVar240 + -5.0) +
                                              fVar240 * fVar207,
                                              (fVar189 + fVar189) * (fVar235 + -5.0) +
                                              fVar235 * fVar189))));
    auVar216._28_4_ = fVar243 + 0.0;
    auVar112._8_4_ = 0x40000000;
    auVar112._0_8_ = 0x4000000040000000;
    auVar112._12_4_ = 0x40000000;
    auVar112._16_4_ = 0x40000000;
    auVar112._20_4_ = 0x40000000;
    auVar112._24_4_ = 0x40000000;
    auVar112._28_4_ = 0x40000000;
    auVar86 = vaddps_avx512vl(auVar254._0_32_,auVar112);
    auVar37._4_4_ = (fVar188 + fVar188) * auVar86._4_4_;
    auVar37._0_4_ = (fVar211 + fVar211) * auVar86._0_4_;
    auVar37._8_4_ = (fVar227 + fVar227) * auVar86._8_4_;
    auVar37._12_4_ = (fVar228 + fVar228) * auVar86._12_4_;
    auVar37._16_4_ = (fVar172 + fVar172) * auVar86._16_4_;
    auVar37._20_4_ = (fVar229 + fVar229) * auVar86._20_4_;
    auVar37._24_4_ = (fVar230 + fVar230) * auVar86._24_4_;
    auVar37._28_4_ = auVar86._28_4_;
    auVar38._4_4_ = fVar188 * 3.0 * fVar188;
    auVar38._0_4_ = fVar211 * 3.0 * fVar211;
    auVar38._8_4_ = fVar227 * 3.0 * fVar227;
    auVar38._12_4_ = fVar228 * 3.0 * fVar228;
    auVar38._16_4_ = fVar172 * 3.0 * fVar172;
    auVar38._20_4_ = fVar229 * 3.0 * fVar229;
    auVar38._24_4_ = fVar230 * 3.0 * fVar230;
    auVar38._28_4_ = fVar210;
    auVar86 = vsubps_avx(auVar37,auVar38);
    auVar87 = vsubps_avx(auVar234._0_32_,auVar36);
    auVar97 = vmulps_avx512vl(auVar97,auVar84);
    auVar102 = vmulps_avx512vl(auVar216,auVar84);
    auVar86 = vmulps_avx512vl(auVar86,auVar84);
    auVar87 = vmulps_avx512vl(auVar87,auVar84);
    auVar39._4_4_ = fStack_2bc * auVar87._4_4_;
    auVar39._0_4_ = local_2c0 * auVar87._0_4_;
    auVar39._8_4_ = fStack_2b8 * auVar87._8_4_;
    auVar39._12_4_ = fStack_2b4 * auVar87._12_4_;
    auVar39._16_4_ = fStack_2b0 * auVar87._16_4_;
    auVar39._20_4_ = fStack_2ac * auVar87._20_4_;
    auVar39._24_4_ = fStack_2a8 * auVar87._24_4_;
    auVar39._28_4_ = fVar243;
    auVar84 = vmulps_avx512vl(local_240,auVar87);
    auVar103 = vmulps_avx512vl(local_2e0,auVar87);
    auVar40._4_4_ = local_300._4_4_ * auVar87._4_4_;
    auVar40._0_4_ = local_300._0_4_ * auVar87._0_4_;
    auVar40._8_4_ = local_300._8_4_ * auVar87._8_4_;
    auVar40._12_4_ = local_300._12_4_ * auVar87._12_4_;
    auVar40._16_4_ = local_300._16_4_ * auVar87._16_4_;
    auVar40._20_4_ = local_300._20_4_ * auVar87._20_4_;
    auVar40._24_4_ = local_300._24_4_ * auVar87._24_4_;
    auVar40._28_4_ = auVar87._28_4_;
    auVar87 = vfmadd231ps_avx512vl(auVar39,auVar86,auVar96);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar253._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar86,local_2a0);
    auVar86 = vfmadd231ps_avx512vl(auVar40,local_220,auVar86);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,auVar93);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar102,auVar91);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar94);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar95,auVar102);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar90);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar97,auVar88);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar97,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar86,auVar92,auVar97);
    auVar41._4_4_ = auVar87._4_4_ * fVar140;
    auVar41._0_4_ = auVar87._0_4_ * fVar140;
    auVar41._8_4_ = auVar87._8_4_ * fVar140;
    auVar41._12_4_ = auVar87._12_4_ * fVar140;
    auVar41._16_4_ = auVar87._16_4_ * fVar140;
    auVar41._20_4_ = auVar87._20_4_ * fVar140;
    auVar41._24_4_ = auVar87._24_4_ * fVar140;
    auVar41._28_4_ = fVar210 + fVar210;
    auVar42._4_4_ = auVar84._4_4_ * fVar140;
    auVar42._0_4_ = auVar84._0_4_ * fVar140;
    auVar42._8_4_ = auVar84._8_4_ * fVar140;
    auVar42._12_4_ = auVar84._12_4_ * fVar140;
    auVar42._16_4_ = auVar84._16_4_ * fVar140;
    auVar42._20_4_ = auVar84._20_4_ * fVar140;
    auVar42._24_4_ = auVar84._24_4_ * fVar140;
    auVar42._28_4_ = auVar85._28_4_;
    auVar43._4_4_ = auVar102._4_4_ * fVar140;
    auVar43._0_4_ = auVar102._0_4_ * fVar140;
    auVar43._8_4_ = auVar102._8_4_ * fVar140;
    auVar43._12_4_ = auVar102._12_4_ * fVar140;
    auVar43._16_4_ = auVar102._16_4_ * fVar140;
    auVar43._20_4_ = auVar102._20_4_ * fVar140;
    auVar43._24_4_ = auVar102._24_4_ * fVar140;
    auVar43._28_4_ = 0;
    fVar189 = fVar140 * auVar97._0_4_;
    fVar207 = fVar140 * auVar97._4_4_;
    auVar44._4_4_ = fVar207;
    auVar44._0_4_ = fVar189;
    fVar208 = fVar140 * auVar97._8_4_;
    auVar44._8_4_ = fVar208;
    fVar209 = fVar140 * auVar97._12_4_;
    auVar44._12_4_ = fVar209;
    fVar210 = fVar140 * auVar97._16_4_;
    auVar44._16_4_ = fVar210;
    fVar211 = fVar140 * auVar97._20_4_;
    auVar44._20_4_ = fVar211;
    fVar188 = fVar140 * auVar97._24_4_;
    auVar44._24_4_ = fVar188;
    auVar44._28_4_ = fVar140;
    auVar78 = vxorps_avx512vl(local_2a0._0_16_,local_2a0._0_16_);
    auVar102 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,ZEXT1632(auVar78));
    local_480 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,ZEXT1632(auVar78));
    auVar87 = ZEXT1632(auVar78);
    auVar104 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,auVar87);
    auVar217._0_4_ = auVar98._0_4_ + fVar189;
    auVar217._4_4_ = auVar98._4_4_ + fVar207;
    auVar217._8_4_ = auVar98._8_4_ + fVar208;
    auVar217._12_4_ = auVar98._12_4_ + fVar209;
    auVar217._16_4_ = auVar98._16_4_ + fVar210;
    auVar217._20_4_ = auVar98._20_4_ + fVar211;
    auVar217._24_4_ = auVar98._24_4_ + fVar188;
    auVar217._28_4_ = auVar98._28_4_ + fVar140;
    auVar97 = vmaxps_avx(auVar98,auVar217);
    auVar86 = vminps_avx(auVar98,auVar217);
    auVar103 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar87);
    auVar105 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar87);
    auVar106 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9fc0,auVar87);
    auVar120 = ZEXT1632(auVar78);
    auVar107 = vpermt2ps_avx512vl(auVar43,_DAT_01fb9fc0,auVar120);
    auVar87 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9fc0,auVar120);
    auVar108 = vsubps_avx512vl(auVar103,auVar87);
    auVar87 = vsubps_avx(auVar102,auVar100);
    auVar239 = ZEXT3264(auVar87);
    auVar84 = vsubps_avx(local_480,auVar101);
    auVar234 = ZEXT3264(auVar84);
    auVar85 = vsubps_avx(auVar104,auVar99);
    auVar98 = vmulps_avx512vl(auVar84,auVar43);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar42,auVar85);
    auVar109 = vmulps_avx512vl(auVar85,auVar41);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar43,auVar87);
    auVar110 = vmulps_avx512vl(auVar87,auVar42);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar41,auVar84);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar98,auVar98);
    auVar98 = vmulps_avx512vl(auVar85,auVar85);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar84,auVar84);
    auVar110 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar87);
    auVar111 = vrcp14ps_avx512vl(auVar110);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar98);
    auVar111 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar109,auVar111);
    auVar112 = vmulps_avx512vl(auVar84,auVar107);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar106,auVar85);
    auVar113 = vmulps_avx512vl(auVar85,auVar105);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar107,auVar87);
    auVar114 = vmulps_avx512vl(auVar87,auVar106);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar105,auVar84);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar109 = vmaxps_avx512vl(auVar109,auVar111);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar111 = vmaxps_avx512vl(auVar108,auVar103);
    auVar97 = vmaxps_avx512vl(auVar97,auVar111);
    auVar111 = vaddps_avx512vl(auVar109,auVar97);
    auVar97 = vminps_avx512vl(auVar108,auVar103);
    auVar97 = vminps_avx(auVar86,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar109);
    auVar113._8_4_ = 0x3f800002;
    auVar113._0_8_ = 0x3f8000023f800002;
    auVar113._12_4_ = 0x3f800002;
    auVar113._16_4_ = 0x3f800002;
    auVar113._20_4_ = 0x3f800002;
    auVar113._24_4_ = 0x3f800002;
    auVar113._28_4_ = 0x3f800002;
    auVar86 = vmulps_avx512vl(auVar111,auVar113);
    auVar114._8_4_ = 0x3f7ffffc;
    auVar114._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar114._12_4_ = 0x3f7ffffc;
    auVar114._16_4_ = 0x3f7ffffc;
    auVar114._20_4_ = 0x3f7ffffc;
    auVar114._24_4_ = 0x3f7ffffc;
    auVar114._28_4_ = 0x3f7ffffc;
    local_6a0 = vmulps_avx512vl(auVar97,auVar114);
    auVar97 = vmulps_avx512vl(auVar86,auVar86);
    auVar86 = vrsqrt14ps_avx512vl(auVar110);
    auVar115._8_4_ = 0xbf000000;
    auVar115._0_8_ = 0xbf000000bf000000;
    auVar115._12_4_ = 0xbf000000;
    auVar115._16_4_ = 0xbf000000;
    auVar115._20_4_ = 0xbf000000;
    auVar115._24_4_ = 0xbf000000;
    auVar115._28_4_ = 0xbf000000;
    auVar103 = vmulps_avx512vl(auVar110,auVar115);
    fVar140 = auVar86._0_4_;
    fVar189 = auVar86._4_4_;
    fVar207 = auVar86._8_4_;
    fVar208 = auVar86._12_4_;
    fVar209 = auVar86._16_4_;
    fVar210 = auVar86._20_4_;
    fVar211 = auVar86._24_4_;
    auVar45._4_4_ = fVar189 * fVar189 * fVar189 * auVar103._4_4_;
    auVar45._0_4_ = fVar140 * fVar140 * fVar140 * auVar103._0_4_;
    auVar45._8_4_ = fVar207 * fVar207 * fVar207 * auVar103._8_4_;
    auVar45._12_4_ = fVar208 * fVar208 * fVar208 * auVar103._12_4_;
    auVar45._16_4_ = fVar209 * fVar209 * fVar209 * auVar103._16_4_;
    auVar45._20_4_ = fVar210 * fVar210 * fVar210 * auVar103._20_4_;
    auVar45._24_4_ = fVar211 * fVar211 * fVar211 * auVar103._24_4_;
    auVar45._28_4_ = auVar111._28_4_;
    auVar116._8_4_ = 0x3fc00000;
    auVar116._0_8_ = 0x3fc000003fc00000;
    auVar116._12_4_ = 0x3fc00000;
    auVar116._16_4_ = 0x3fc00000;
    auVar116._20_4_ = 0x3fc00000;
    auVar116._24_4_ = 0x3fc00000;
    auVar116._28_4_ = 0x3fc00000;
    auVar86 = vfmadd231ps_avx512vl(auVar45,auVar86,auVar116);
    auVar103 = vmulps_avx512vl(auVar87,auVar86);
    auVar108 = vmulps_avx512vl(auVar84,auVar86);
    auVar109 = vmulps_avx512vl(auVar85,auVar86);
    auVar110 = vsubps_avx512vl(auVar120,auVar100);
    auVar111 = vsubps_avx512vl(auVar120,auVar101);
    auVar112 = vsubps_avx512vl(auVar120,auVar99);
    local_880 = auVar252._0_32_;
    auVar113 = vmulps_avx512vl(local_880,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_3c0,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_4a0,auVar110);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar115 = vmulps_avx512vl(local_880,auVar109);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar108,local_3c0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar103,local_4a0);
    auVar109 = vmulps_avx512vl(auVar112,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar108);
    auVar103 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar103);
    auVar108 = vmulps_avx512vl(auVar115,auVar115);
    auVar109 = vsubps_avx512vl(local_260,auVar108);
    auVar116 = vmulps_avx512vl(auVar115,auVar103);
    auVar113 = vsubps_avx512vl(auVar113,auVar116);
    auVar113 = vaddps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar103,auVar103);
    local_7c0 = vsubps_avx512vl(auVar114,auVar116);
    auVar97 = vsubps_avx512vl(local_7c0,auVar97);
    local_5a0 = vmulps_avx512vl(auVar113,auVar113);
    auVar117._8_4_ = 0x40800000;
    auVar117._0_8_ = 0x4080000040800000;
    auVar117._12_4_ = 0x40800000;
    auVar117._16_4_ = 0x40800000;
    auVar117._20_4_ = 0x40800000;
    auVar117._24_4_ = 0x40800000;
    auVar117._28_4_ = 0x40800000;
    _local_7e0 = vmulps_avx512vl(auVar109,auVar117);
    auVar114 = vmulps_avx512vl(_local_7e0,auVar97);
    auVar114 = vsubps_avx512vl(local_5a0,auVar114);
    uVar74 = vcmpps_avx512vl(auVar114,auVar120,5);
    bVar66 = (byte)uVar74;
    if (bVar66 == 0) {
LAB_01a3db39:
      auVar223 = ZEXT3264(_DAT_01f7b040);
      auVar254 = ZEXT3264(auVar98);
      auVar245 = ZEXT3264(auVar104);
      auVar244 = ZEXT3264(local_480);
      auVar253 = ZEXT3264(local_8a0);
    }
    else {
      auVar114 = vsqrtps_avx512vl(auVar114);
      auVar116 = vaddps_avx512vl(auVar109,auVar109);
      local_600 = vrcp14ps_avx512vl(auVar116);
      auVar98 = vfnmadd213ps_avx512vl(local_600,auVar116,auVar98);
      auVar98 = vfmadd132ps_avx512vl(auVar98,local_600,local_600);
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar28._16_4_ = 0x80000000;
      auVar28._20_4_ = 0x80000000;
      auVar28._24_4_ = 0x80000000;
      auVar28._28_4_ = 0x80000000;
      local_760 = vxorps_avx512vl(auVar113,auVar28);
      auVar117 = vsubps_avx512vl(local_760,auVar114);
      local_5e0 = vmulps_avx512vl(auVar117,auVar98);
      auVar114 = vsubps_avx512vl(auVar114,auVar113);
      local_5c0 = vmulps_avx512vl(auVar114,auVar98);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar98,local_5e0);
      auVar118._0_4_ =
           (uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar98._0_4_;
      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar73 * auVar114._4_4_ | (uint)!bVar73 * auVar98._4_4_;
      bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar73 * auVar114._8_4_ | (uint)!bVar73 * auVar98._8_4_;
      bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar73 * auVar114._12_4_ | (uint)!bVar73 * auVar98._12_4_;
      bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar73 * auVar114._16_4_ | (uint)!bVar73 * auVar98._16_4_;
      bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar73 * auVar114._20_4_ | (uint)!bVar73 * auVar98._20_4_;
      bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar73 * auVar114._24_4_ | (uint)!bVar73 * auVar98._24_4_;
      bVar73 = SUB81(uVar74 >> 7,0);
      auVar118._28_4_ = (uint)bVar73 * auVar114._28_4_ | (uint)!bVar73 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar98,local_5c0);
      auVar119._0_4_ =
           (uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar98._0_4_;
      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar73 * auVar114._4_4_ | (uint)!bVar73 * auVar98._4_4_;
      bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar73 * auVar114._8_4_ | (uint)!bVar73 * auVar98._8_4_;
      bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar73 * auVar114._12_4_ | (uint)!bVar73 * auVar98._12_4_;
      bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar73 * auVar114._16_4_ | (uint)!bVar73 * auVar98._16_4_;
      bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar73 * auVar114._20_4_ | (uint)!bVar73 * auVar98._20_4_;
      bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar73 * auVar114._24_4_ | (uint)!bVar73 * auVar98._24_4_;
      bVar73 = SUB81(uVar74 >> 7,0);
      auVar119._28_4_ = (uint)bVar73 * auVar114._28_4_ | (uint)!bVar73 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar98);
      local_780 = vmaxps_avx512vl(local_280,auVar98);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      local_620 = vmulps_avx512vl(local_780,auVar29);
      vandps_avx512vl(auVar109,auVar98);
      uVar71 = vcmpps_avx512vl(local_620,local_620,1);
      uVar74 = uVar74 & uVar71;
      bVar70 = (byte)uVar74;
      if (bVar70 != 0) {
        uVar71 = vcmpps_avx512vl(auVar97,_DAT_01f7b000,2);
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar108 = vblendmps_avx512vl(auVar97,auVar98);
        bVar68 = (byte)uVar71;
        uVar75 = (uint)(bVar68 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar68 & 1) * local_620._0_4_;
        bVar73 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar133 = (uint)bVar73 * auVar108._4_4_ | (uint)!bVar73 * local_620._4_4_;
        bVar73 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar134 = (uint)bVar73 * auVar108._8_4_ | (uint)!bVar73 * local_620._8_4_;
        bVar73 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar135 = (uint)bVar73 * auVar108._12_4_ | (uint)!bVar73 * local_620._12_4_;
        bVar73 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar136 = (uint)bVar73 * auVar108._16_4_ | (uint)!bVar73 * local_620._16_4_;
        bVar73 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar137 = (uint)bVar73 * auVar108._20_4_ | (uint)!bVar73 * local_620._20_4_;
        bVar73 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar138 = (uint)bVar73 * auVar108._24_4_ | (uint)!bVar73 * local_620._24_4_;
        bVar73 = SUB81(uVar71 >> 7,0);
        uVar139 = (uint)bVar73 * auVar108._28_4_ | (uint)!bVar73 * local_620._28_4_;
        auVar118._0_4_ = (bVar70 & 1) * uVar75 | !(bool)(bVar70 & 1) * auVar118._0_4_;
        bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar118._4_4_ = bVar73 * uVar133 | !bVar73 * auVar118._4_4_;
        bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar118._8_4_ = bVar73 * uVar134 | !bVar73 * auVar118._8_4_;
        bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar118._12_4_ = bVar73 * uVar135 | !bVar73 * auVar118._12_4_;
        bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar118._16_4_ = bVar73 * uVar136 | !bVar73 * auVar118._16_4_;
        bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar118._20_4_ = bVar73 * uVar137 | !bVar73 * auVar118._20_4_;
        bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar118._24_4_ = bVar73 * uVar138 | !bVar73 * auVar118._24_4_;
        bVar73 = SUB81(uVar74 >> 7,0);
        auVar118._28_4_ = bVar73 * uVar139 | !bVar73 * auVar118._28_4_;
        auVar97 = vblendmps_avx512vl(auVar98,auVar97);
        bVar73 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar15 = SUB81(uVar71 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar70 & 1) *
             ((uint)(bVar68 & 1) * auVar97._0_4_ | !(bool)(bVar68 & 1) * uVar75) |
             !(bool)(bVar70 & 1) * auVar119._0_4_;
        bVar9 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar9 * ((uint)bVar73 * auVar97._4_4_ | !bVar73 * uVar133) |
             !bVar9 * auVar119._4_4_;
        bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar73 * ((uint)bVar10 * auVar97._8_4_ | !bVar10 * uVar134) |
             !bVar73 * auVar119._8_4_;
        bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar73 * ((uint)bVar11 * auVar97._12_4_ | !bVar11 * uVar135) |
             !bVar73 * auVar119._12_4_;
        bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar73 * ((uint)bVar12 * auVar97._16_4_ | !bVar12 * uVar136) |
             !bVar73 * auVar119._16_4_;
        bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar73 * ((uint)bVar13 * auVar97._20_4_ | !bVar13 * uVar137) |
             !bVar73 * auVar119._20_4_;
        bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar73 * ((uint)bVar14 * auVar97._24_4_ | !bVar14 * uVar138) |
             !bVar73 * auVar119._24_4_;
        bVar73 = SUB81(uVar74 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar73 * ((uint)bVar15 * auVar97._28_4_ | !bVar15 * uVar139) |
             !bVar73 * auVar119._28_4_;
        bVar66 = (~bVar70 | bVar68) & bVar66;
      }
      if ((bVar66 & 0x7f) == 0) {
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        goto LAB_01a3db39;
      }
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar107 = vxorps_avx512vl(auVar107,auVar97);
      auVar105 = vxorps_avx512vl(auVar105,auVar97);
      auVar223 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      auVar106 = vxorps_avx512vl(auVar106,auVar97);
      auVar78 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),ZEXT416((uint)local_670._0_4_)
                              );
      auVar98 = vbroadcastss_avx512vl(auVar78);
      auVar108 = vminps_avx512vl(auVar98,auVar119);
      auVar65._4_4_ = fStack_31c;
      auVar65._0_4_ = local_320;
      auVar65._8_4_ = fStack_318;
      auVar65._12_4_ = fStack_314;
      auVar65._16_4_ = fStack_310;
      auVar65._20_4_ = fStack_30c;
      auVar65._24_4_ = fStack_308;
      auVar65._28_4_ = fStack_304;
      auVar109 = vmaxps_avx512vl(auVar65,auVar118);
      auVar98 = vmulps_avx512vl(auVar112,auVar43);
      auVar98 = vfmadd213ps_avx512vl(auVar111,auVar42,auVar98);
      auVar78 = vfmadd213ps_fma(auVar110,auVar41,auVar98);
      auVar98 = vmulps_avx512vl(local_880,auVar43);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_3c0,auVar42);
      auVar110 = vfmadd231ps_avx512vl(auVar98,local_4a0,auVar41);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar110,auVar111);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar111,auVar112,1);
      auVar114 = vxorps_avx512vl(ZEXT1632(auVar78),auVar97);
      auVar117 = vrcp14ps_avx512vl(auVar110);
      auVar120 = vxorps_avx512vl(auVar110,auVar97);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar121 = vfnmadd213ps_avx512vl(auVar117,auVar110,auVar98);
      auVar78 = vfmadd132ps_fma(auVar121,auVar117,auVar117);
      fVar140 = auVar78._0_4_ * auVar114._0_4_;
      fVar189 = auVar78._4_4_ * auVar114._4_4_;
      auVar46._4_4_ = fVar189;
      auVar46._0_4_ = fVar140;
      fVar207 = auVar78._8_4_ * auVar114._8_4_;
      auVar46._8_4_ = fVar207;
      fVar208 = auVar78._12_4_ * auVar114._12_4_;
      auVar46._12_4_ = fVar208;
      fVar209 = auVar114._16_4_ * 0.0;
      auVar46._16_4_ = fVar209;
      fVar210 = auVar114._20_4_ * 0.0;
      auVar46._20_4_ = fVar210;
      fVar211 = auVar114._24_4_ * 0.0;
      auVar46._24_4_ = fVar211;
      auVar46._28_4_ = auVar114._28_4_;
      uVar18 = vcmpps_avx512vl(auVar110,auVar120,1);
      bVar70 = (byte)uVar16 | (byte)uVar18;
      auVar251._8_4_ = 0xff800000;
      auVar251._0_8_ = 0xff800000ff800000;
      auVar251._12_4_ = 0xff800000;
      auVar251._16_4_ = 0xff800000;
      auVar251._20_4_ = 0xff800000;
      auVar251._24_4_ = 0xff800000;
      auVar251._28_4_ = 0xff800000;
      auVar121 = vblendmps_avx512vl(auVar46,auVar251);
      auVar122._0_4_ =
           (uint)(bVar70 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar117._0_4_;
      bVar73 = (bool)(bVar70 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar73 * auVar121._4_4_ | (uint)!bVar73 * auVar117._4_4_;
      bVar73 = (bool)(bVar70 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar73 * auVar121._8_4_ | (uint)!bVar73 * auVar117._8_4_;
      bVar73 = (bool)(bVar70 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar73 * auVar121._12_4_ | (uint)!bVar73 * auVar117._12_4_;
      bVar73 = (bool)(bVar70 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar73 * auVar121._16_4_ | (uint)!bVar73 * auVar117._16_4_;
      bVar73 = (bool)(bVar70 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar73 * auVar121._20_4_ | (uint)!bVar73 * auVar117._20_4_;
      bVar73 = (bool)(bVar70 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar73 * auVar121._24_4_ | (uint)!bVar73 * auVar117._24_4_;
      auVar122._28_4_ =
           (uint)(bVar70 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar70 >> 7) * auVar117._28_4_;
      auVar109 = vmaxps_avx512vl(auVar109,auVar122);
      uVar18 = vcmpps_avx512vl(auVar110,auVar120,6);
      bVar70 = (byte)uVar16 | (byte)uVar18;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123._0_4_ =
           (uint)(bVar70 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar70 & 1) * (int)fVar140;
      bVar73 = (bool)(bVar70 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar73 * auVar110._4_4_ | (uint)!bVar73 * (int)fVar189;
      bVar73 = (bool)(bVar70 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar73 * auVar110._8_4_ | (uint)!bVar73 * (int)fVar207;
      bVar73 = (bool)(bVar70 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar73 * auVar110._12_4_ | (uint)!bVar73 * (int)fVar208;
      bVar73 = (bool)(bVar70 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar73 * auVar110._16_4_ | (uint)!bVar73 * (int)fVar209;
      bVar73 = (bool)(bVar70 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar73 * auVar110._20_4_ | (uint)!bVar73 * (int)fVar210;
      bVar73 = (bool)(bVar70 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar73 * auVar110._24_4_ | (uint)!bVar73 * (int)fVar211;
      auVar123._28_4_ =
           (uint)(bVar70 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar70 >> 7) * auVar114._28_4_;
      auVar114 = vminps_avx512vl(auVar108,auVar123);
      auVar78 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar78),auVar102);
      auVar108 = vsubps_avx512vl(ZEXT1632(auVar78),local_480);
      auVar120 = ZEXT1632(auVar78);
      auVar117 = vsubps_avx512vl(auVar120,auVar104);
      auVar117 = vmulps_avx512vl(auVar117,auVar107);
      auVar108 = vfmadd231ps_avx512vl(auVar117,auVar106,auVar108);
      auVar102 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar102);
      auVar107 = vmulps_avx512vl(local_880,auVar107);
      auVar106 = vfmadd231ps_avx512vl(auVar107,local_3c0,auVar106);
      auVar105 = vfmadd231ps_avx512vl(auVar106,local_4a0,auVar105);
      vandps_avx512vl(auVar105,auVar111);
      uVar16 = vcmpps_avx512vl(auVar105,auVar112,1);
      auVar102 = vxorps_avx512vl(auVar102,auVar97);
      auVar106 = vrcp14ps_avx512vl(auVar105);
      auVar104 = vxorps_avx512vl(auVar105,auVar97);
      auVar97 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar98);
      auVar78 = vfmadd132ps_fma(auVar97,auVar106,auVar106);
      fVar140 = auVar78._0_4_ * auVar102._0_4_;
      fVar189 = auVar78._4_4_ * auVar102._4_4_;
      auVar47._4_4_ = fVar189;
      auVar47._0_4_ = fVar140;
      fVar207 = auVar78._8_4_ * auVar102._8_4_;
      auVar47._8_4_ = fVar207;
      fVar208 = auVar78._12_4_ * auVar102._12_4_;
      auVar47._12_4_ = fVar208;
      fVar209 = auVar102._16_4_ * 0.0;
      auVar47._16_4_ = fVar209;
      fVar210 = auVar102._20_4_ * 0.0;
      auVar47._20_4_ = fVar210;
      fVar211 = auVar102._24_4_ * 0.0;
      auVar47._24_4_ = fVar211;
      auVar47._28_4_ = auVar102._28_4_;
      uVar18 = vcmpps_avx512vl(auVar105,auVar104,1);
      bVar70 = (byte)uVar16 | (byte)uVar18;
      auVar97 = vblendmps_avx512vl(auVar47,auVar251);
      auVar124._0_4_ =
           (uint)(bVar70 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar106._0_4_;
      bVar73 = (bool)(bVar70 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar73 * auVar97._4_4_ | (uint)!bVar73 * auVar106._4_4_;
      bVar73 = (bool)(bVar70 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar73 * auVar97._8_4_ | (uint)!bVar73 * auVar106._8_4_;
      bVar73 = (bool)(bVar70 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar73 * auVar97._12_4_ | (uint)!bVar73 * auVar106._12_4_;
      bVar73 = (bool)(bVar70 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar73 * auVar97._16_4_ | (uint)!bVar73 * auVar106._16_4_;
      bVar73 = (bool)(bVar70 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar73 * auVar97._20_4_ | (uint)!bVar73 * auVar106._20_4_;
      bVar73 = (bool)(bVar70 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar73 * auVar97._24_4_ | (uint)!bVar73 * auVar106._24_4_;
      auVar124._28_4_ =
           (uint)(bVar70 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar70 >> 7) * auVar106._28_4_;
      local_480 = vmaxps_avx(auVar109,auVar124);
      uVar18 = vcmpps_avx512vl(auVar105,auVar104,6);
      bVar70 = (byte)uVar16 | (byte)uVar18;
      auVar125._0_4_ =
           (uint)(bVar70 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar70 & 1) * (int)fVar140;
      bVar73 = (bool)(bVar70 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar73 * auVar110._4_4_ | (uint)!bVar73 * (int)fVar189;
      bVar73 = (bool)(bVar70 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar73 * auVar110._8_4_ | (uint)!bVar73 * (int)fVar207;
      bVar73 = (bool)(bVar70 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar73 * auVar110._12_4_ | (uint)!bVar73 * (int)fVar208;
      bVar73 = (bool)(bVar70 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar73 * auVar110._16_4_ | (uint)!bVar73 * (int)fVar209;
      bVar73 = (bool)(bVar70 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar73 * auVar110._20_4_ | (uint)!bVar73 * (int)fVar210;
      bVar73 = (bool)(bVar70 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar73 * auVar110._24_4_ | (uint)!bVar73 * (int)fVar211;
      auVar125._28_4_ =
           (uint)(bVar70 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar70 >> 7) * auVar102._28_4_;
      local_380 = vminps_avx(auVar114,auVar125);
      uVar16 = vcmpps_avx512vl(local_480,local_380,2);
      bVar66 = bVar66 & 0x7f & (byte)uVar16;
      if (bVar66 == 0) {
        auVar252 = ZEXT3264(local_880);
        goto LAB_01a3db39;
      }
      auVar102 = vmaxps_avx512vl(auVar120,local_6a0);
      auVar97 = vfmadd213ps_avx512vl(local_5e0,auVar115,auVar103);
      fVar140 = auVar86._0_4_;
      fVar189 = auVar86._4_4_;
      auVar48._4_4_ = fVar189 * auVar97._4_4_;
      auVar48._0_4_ = fVar140 * auVar97._0_4_;
      fVar207 = auVar86._8_4_;
      auVar48._8_4_ = fVar207 * auVar97._8_4_;
      fVar208 = auVar86._12_4_;
      auVar48._12_4_ = fVar208 * auVar97._12_4_;
      fVar209 = auVar86._16_4_;
      auVar48._16_4_ = fVar209 * auVar97._16_4_;
      fVar210 = auVar86._20_4_;
      auVar48._20_4_ = fVar210 * auVar97._20_4_;
      fVar211 = auVar86._24_4_;
      auVar48._24_4_ = fVar211 * auVar97._24_4_;
      auVar48._28_4_ = auVar97._28_4_;
      auVar97 = vfmadd213ps_avx512vl(local_5c0,auVar115,auVar103);
      auVar49._4_4_ = fVar189 * auVar97._4_4_;
      auVar49._0_4_ = fVar140 * auVar97._0_4_;
      auVar49._8_4_ = fVar207 * auVar97._8_4_;
      auVar49._12_4_ = fVar208 * auVar97._12_4_;
      auVar49._16_4_ = fVar209 * auVar97._16_4_;
      auVar49._20_4_ = fVar210 * auVar97._20_4_;
      auVar49._24_4_ = fVar211 * auVar97._24_4_;
      auVar49._28_4_ = auVar97._28_4_;
      auVar97 = vminps_avx512vl(auVar48,auVar98);
      auVar55 = ZEXT812(0);
      auVar105 = ZEXT1232(auVar55) << 0x20;
      auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar55) << 0x20);
      auVar106 = vminps_avx512vl(auVar49,auVar98);
      auVar50._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar97._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar50,local_860,local_840);
      auVar97 = vmaxps_avx(auVar106,ZEXT1232(auVar55) << 0x20);
      auVar51._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar97._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar51,local_860,local_840);
      auVar52._4_4_ = auVar102._4_4_ * auVar102._4_4_;
      auVar52._0_4_ = auVar102._0_4_ * auVar102._0_4_;
      auVar52._8_4_ = auVar102._8_4_ * auVar102._8_4_;
      auVar52._12_4_ = auVar102._12_4_ * auVar102._12_4_;
      auVar52._16_4_ = auVar102._16_4_ * auVar102._16_4_;
      auVar52._20_4_ = auVar102._20_4_ * auVar102._20_4_;
      auVar52._24_4_ = auVar102._24_4_ * auVar102._24_4_;
      auVar52._28_4_ = auVar102._28_4_;
      auVar97 = vsubps_avx(local_7c0,auVar52);
      auVar53._4_4_ = auVar97._4_4_ * (float)local_7e0._4_4_;
      auVar53._0_4_ = auVar97._0_4_ * (float)local_7e0._0_4_;
      auVar53._8_4_ = auVar97._8_4_ * fStack_7d8;
      auVar53._12_4_ = auVar97._12_4_ * fStack_7d4;
      auVar53._16_4_ = auVar97._16_4_ * fStack_7d0;
      auVar53._20_4_ = auVar97._20_4_ * fStack_7cc;
      auVar53._24_4_ = auVar97._24_4_ * fStack_7c8;
      auVar53._28_4_ = auVar102._28_4_;
      auVar102 = vsubps_avx(local_5a0,auVar53);
      uVar16 = vcmpps_avx512vl(auVar102,ZEXT1232(auVar55) << 0x20,5);
      bVar70 = (byte)uVar16;
      auVar253 = ZEXT3264(local_8a0);
      if (bVar70 == 0) {
        bVar70 = 0;
        auVar86 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar87 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar244 = ZEXT864(0) << 0x20;
        auVar126._8_4_ = 0x7f800000;
        auVar126._0_8_ = 0x7f8000007f800000;
        auVar126._12_4_ = 0x7f800000;
        auVar126._16_4_ = 0x7f800000;
        auVar126._20_4_ = 0x7f800000;
        auVar126._24_4_ = 0x7f800000;
        auVar126._28_4_ = 0x7f800000;
        auVar127._8_4_ = 0xff800000;
        auVar127._0_8_ = 0xff800000ff800000;
        auVar127._12_4_ = 0xff800000;
        auVar127._16_4_ = 0xff800000;
        auVar127._20_4_ = 0xff800000;
        auVar127._24_4_ = 0xff800000;
        auVar127._28_4_ = 0xff800000;
      }
      else {
        auVar79 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
        uVar74 = vcmpps_avx512vl(auVar102,auVar120,5);
        auVar102 = vsqrtps_avx(auVar102);
        auVar98 = vfnmadd213ps_avx512vl(auVar116,local_600,auVar98);
        auVar105 = vfmadd132ps_avx512vl(auVar98,local_600,local_600);
        auVar98 = vsubps_avx(local_760,auVar102);
        auVar107 = vmulps_avx512vl(auVar98,auVar105);
        auVar98 = vsubps_avx512vl(auVar102,auVar113);
        auVar108 = vmulps_avx512vl(auVar98,auVar105);
        auVar98 = vfmadd213ps_avx512vl(auVar115,auVar107,auVar103);
        auVar54._4_4_ = fVar189 * auVar98._4_4_;
        auVar54._0_4_ = fVar140 * auVar98._0_4_;
        auVar54._8_4_ = fVar207 * auVar98._8_4_;
        auVar54._12_4_ = fVar208 * auVar98._12_4_;
        auVar54._16_4_ = fVar209 * auVar98._16_4_;
        auVar54._20_4_ = fVar210 * auVar98._20_4_;
        auVar54._24_4_ = fVar211 * auVar98._24_4_;
        auVar54._28_4_ = auVar106._28_4_;
        auVar98 = vmulps_avx512vl(local_4a0,auVar107);
        auVar102 = vmulps_avx512vl(local_3c0,auVar107);
        auVar105 = vmulps_avx512vl(local_880,auVar107);
        auVar106 = vfmadd213ps_avx512vl(auVar87,auVar54,auVar100);
        auVar98 = vsubps_avx512vl(auVar98,auVar106);
        auVar106 = vfmadd213ps_avx512vl(auVar84,auVar54,auVar101);
        auVar102 = vsubps_avx512vl(auVar102,auVar106);
        auVar78 = vfmadd213ps_fma(auVar54,auVar85,auVar99);
        auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar78));
        auVar244 = ZEXT3264(auVar105);
        auVar103 = vfmadd213ps_avx512vl(auVar115,auVar108,auVar103);
        auVar103 = vmulps_avx512vl(auVar86,auVar103);
        auVar86 = vmulps_avx512vl(local_4a0,auVar108);
        auVar106 = vmulps_avx512vl(local_3c0,auVar108);
        auVar109 = vmulps_avx512vl(local_880,auVar108);
        auVar78 = vfmadd213ps_fma(auVar87,auVar103,auVar100);
        auVar105 = vsubps_avx(auVar86,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar84,auVar103,auVar101);
        auVar86 = vsubps_avx512vl(auVar106,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar85,auVar103,auVar99);
        auVar87 = vsubps_avx512vl(auVar109,ZEXT1632(auVar78));
        auVar147._8_4_ = 0x7f800000;
        auVar147._0_8_ = 0x7f8000007f800000;
        auVar147._12_4_ = 0x7f800000;
        auVar147._16_4_ = 0x7f800000;
        auVar147._20_4_ = 0x7f800000;
        auVar147._24_4_ = 0x7f800000;
        auVar147._28_4_ = 0x7f800000;
        auVar84 = vblendmps_avx512vl(auVar147,auVar107);
        bVar73 = (bool)((byte)uVar74 & 1);
        auVar126._0_4_ = (uint)bVar73 * auVar84._0_4_ | (uint)!bVar73 * auVar100._0_4_;
        bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar73 * auVar84._4_4_ | (uint)!bVar73 * auVar100._4_4_;
        bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar73 * auVar84._8_4_ | (uint)!bVar73 * auVar100._8_4_;
        bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar73 * auVar84._12_4_ | (uint)!bVar73 * auVar100._12_4_;
        bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar73 * auVar84._16_4_ | (uint)!bVar73 * auVar100._16_4_;
        bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar73 * auVar84._20_4_ | (uint)!bVar73 * auVar100._20_4_;
        bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar73 * auVar84._24_4_ | (uint)!bVar73 * auVar100._24_4_;
        bVar73 = SUB81(uVar74 >> 7,0);
        auVar126._28_4_ = (uint)bVar73 * auVar84._28_4_ | (uint)!bVar73 * auVar100._28_4_;
        auVar148._8_4_ = 0xff800000;
        auVar148._0_8_ = 0xff800000ff800000;
        auVar148._12_4_ = 0xff800000;
        auVar148._16_4_ = 0xff800000;
        auVar148._20_4_ = 0xff800000;
        auVar148._24_4_ = 0xff800000;
        auVar148._28_4_ = 0xff800000;
        auVar84 = vblendmps_avx512vl(auVar148,auVar108);
        bVar73 = (bool)((byte)uVar74 & 1);
        auVar127._0_4_ = (uint)bVar73 * auVar84._0_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar73 * auVar84._4_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar73 * auVar84._8_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar73 * auVar84._12_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar73 * auVar84._16_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar73 * auVar84._20_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar73 * auVar84._24_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = SUB81(uVar74 >> 7,0);
        auVar127._28_4_ = (uint)bVar73 * auVar84._28_4_ | (uint)!bVar73 * -0x800000;
        auVar30._8_4_ = 0x36000000;
        auVar30._0_8_ = 0x3600000036000000;
        auVar30._12_4_ = 0x36000000;
        auVar30._16_4_ = 0x36000000;
        auVar30._20_4_ = 0x36000000;
        auVar30._24_4_ = 0x36000000;
        auVar30._28_4_ = 0x36000000;
        auVar84 = vmulps_avx512vl(local_780,auVar30);
        uVar71 = vcmpps_avx512vl(auVar84,local_620,0xe);
        uVar74 = uVar74 & uVar71;
        bVar68 = (byte)uVar74;
        if (bVar68 != 0) {
          uVar71 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar79),2);
          auVar238._8_4_ = 0x7f800000;
          auVar238._0_8_ = 0x7f8000007f800000;
          auVar238._12_4_ = 0x7f800000;
          auVar238._16_4_ = 0x7f800000;
          auVar238._20_4_ = 0x7f800000;
          auVar238._24_4_ = 0x7f800000;
          auVar238._28_4_ = 0x7f800000;
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          auVar97 = vblendmps_avx512vl(auVar238,auVar249);
          bVar67 = (byte)uVar71;
          uVar75 = (uint)(bVar67 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar84._0_4_;
          bVar73 = (bool)((byte)(uVar71 >> 1) & 1);
          uVar133 = (uint)bVar73 * auVar97._4_4_ | (uint)!bVar73 * auVar84._4_4_;
          bVar73 = (bool)((byte)(uVar71 >> 2) & 1);
          uVar134 = (uint)bVar73 * auVar97._8_4_ | (uint)!bVar73 * auVar84._8_4_;
          bVar73 = (bool)((byte)(uVar71 >> 3) & 1);
          uVar135 = (uint)bVar73 * auVar97._12_4_ | (uint)!bVar73 * auVar84._12_4_;
          bVar73 = (bool)((byte)(uVar71 >> 4) & 1);
          uVar136 = (uint)bVar73 * auVar97._16_4_ | (uint)!bVar73 * auVar84._16_4_;
          bVar73 = (bool)((byte)(uVar71 >> 5) & 1);
          uVar137 = (uint)bVar73 * auVar97._20_4_ | (uint)!bVar73 * auVar84._20_4_;
          bVar73 = (bool)((byte)(uVar71 >> 6) & 1);
          uVar138 = (uint)bVar73 * auVar97._24_4_ | (uint)!bVar73 * auVar84._24_4_;
          bVar73 = SUB81(uVar71 >> 7,0);
          uVar139 = (uint)bVar73 * auVar97._28_4_ | (uint)!bVar73 * auVar84._28_4_;
          auVar126._0_4_ = (bVar68 & 1) * uVar75 | !(bool)(bVar68 & 1) * auVar126._0_4_;
          bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar126._4_4_ = bVar73 * uVar133 | !bVar73 * auVar126._4_4_;
          bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar126._8_4_ = bVar73 * uVar134 | !bVar73 * auVar126._8_4_;
          bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar126._12_4_ = bVar73 * uVar135 | !bVar73 * auVar126._12_4_;
          bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar126._16_4_ = bVar73 * uVar136 | !bVar73 * auVar126._16_4_;
          bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar126._20_4_ = bVar73 * uVar137 | !bVar73 * auVar126._20_4_;
          bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar126._24_4_ = bVar73 * uVar138 | !bVar73 * auVar126._24_4_;
          bVar73 = SUB81(uVar74 >> 7,0);
          auVar126._28_4_ = bVar73 * uVar139 | !bVar73 * auVar126._28_4_;
          auVar97 = vblendmps_avx512vl(auVar249,auVar238);
          bVar73 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar71 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
          bVar15 = SUB81(uVar71 >> 7,0);
          auVar127._0_4_ =
               (uint)(bVar68 & 1) *
               ((uint)(bVar67 & 1) * auVar97._0_4_ | !(bool)(bVar67 & 1) * uVar75) |
               !(bool)(bVar68 & 1) * auVar127._0_4_;
          bVar9 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar127._4_4_ =
               (uint)bVar9 * ((uint)bVar73 * auVar97._4_4_ | !bVar73 * uVar133) |
               !bVar9 * auVar127._4_4_;
          bVar73 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar127._8_4_ =
               (uint)bVar73 * ((uint)bVar10 * auVar97._8_4_ | !bVar10 * uVar134) |
               !bVar73 * auVar127._8_4_;
          bVar73 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar127._12_4_ =
               (uint)bVar73 * ((uint)bVar11 * auVar97._12_4_ | !bVar11 * uVar135) |
               !bVar73 * auVar127._12_4_;
          bVar73 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar127._16_4_ =
               (uint)bVar73 * ((uint)bVar12 * auVar97._16_4_ | !bVar12 * uVar136) |
               !bVar73 * auVar127._16_4_;
          bVar73 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar127._20_4_ =
               (uint)bVar73 * ((uint)bVar13 * auVar97._20_4_ | !bVar13 * uVar137) |
               !bVar73 * auVar127._20_4_;
          bVar73 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar127._24_4_ =
               (uint)bVar73 * ((uint)bVar14 * auVar97._24_4_ | !bVar14 * uVar138) |
               !bVar73 * auVar127._24_4_;
          bVar73 = SUB81(uVar74 >> 7,0);
          auVar127._28_4_ =
               (uint)bVar73 * ((uint)bVar15 * auVar97._28_4_ | !bVar15 * uVar139) |
               !bVar73 * auVar127._28_4_;
          bVar70 = (~bVar68 | bVar67) & bVar70;
        }
      }
      auVar252 = ZEXT3264(local_880);
      auVar97 = vmulps_avx512vl(local_880,auVar87);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_3c0,auVar86);
      auVar239 = ZEXT3264(local_3c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_4a0,auVar105);
      auVar245 = ZEXT3264(local_480);
      _local_200 = local_480;
      local_1e0 = vminps_avx(local_380,auVar126);
      auVar233._8_4_ = 0x7fffffff;
      auVar233._0_8_ = 0x7fffffff7fffffff;
      auVar233._12_4_ = 0x7fffffff;
      auVar233._16_4_ = 0x7fffffff;
      auVar233._20_4_ = 0x7fffffff;
      auVar233._24_4_ = 0x7fffffff;
      auVar233._28_4_ = 0x7fffffff;
      auVar234 = ZEXT3264(auVar233);
      auVar97 = vandps_avx(auVar97,auVar233);
      _local_3a0 = vmaxps_avx(local_480,auVar127);
      auVar226._8_4_ = 0x3e99999a;
      auVar226._0_8_ = 0x3e99999a3e99999a;
      auVar226._12_4_ = 0x3e99999a;
      auVar226._16_4_ = 0x3e99999a;
      auVar226._20_4_ = 0x3e99999a;
      auVar226._24_4_ = 0x3e99999a;
      auVar226._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar97,auVar226,1);
      uVar18 = vcmpps_avx512vl(local_480,local_1e0,2);
      bVar68 = (byte)uVar18 & bVar66;
      uVar17 = vcmpps_avx512vl(_local_3a0,local_380,2);
      if ((bVar66 & ((byte)uVar17 | (byte)uVar18)) == 0) {
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar254 = ZEXT3264(auVar97);
        auVar223 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        _local_440 = _local_3a0;
        local_8b0 = (uint)(byte)((byte)uVar16 | ~bVar70);
        auVar97 = vmulps_avx512vl(local_880,auVar244._0_32_);
        auVar78 = vfmadd213ps_fma(auVar102,local_3c0,auVar97);
        auVar97 = vfmadd213ps_avx512vl(auVar98,local_4a0,ZEXT1632(auVar78));
        auVar97 = vandps_avx(auVar97,auVar233);
        uVar16 = vcmpps_avx512vl(auVar97,auVar226,1);
        bVar70 = (byte)uVar16 | ~bVar70;
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar150,auVar31);
        local_360._0_4_ = (uint)(bVar70 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar70 & 1) * 2;
        bVar73 = (bool)(bVar70 >> 1 & 1);
        local_360._4_4_ = (uint)bVar73 * auVar97._4_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar70 >> 2 & 1);
        local_360._8_4_ = (uint)bVar73 * auVar97._8_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar70 >> 3 & 1);
        local_360._12_4_ = (uint)bVar73 * auVar97._12_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar70 >> 4 & 1);
        local_360._16_4_ = (uint)bVar73 * auVar97._16_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar70 >> 5 & 1);
        local_360._20_4_ = (uint)bVar73 * auVar97._20_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar70 >> 6 & 1);
        local_360._24_4_ = (uint)bVar73 * auVar97._24_4_ | (uint)!bVar73 * 2;
        local_360._28_4_ = (uint)(bVar70 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar70 >> 7) * 2;
        local_3e0 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_3e0,local_360,5);
        local_8ac = (uint)bVar68;
        local_420 = local_480._0_4_ + (float)local_460._0_4_;
        fStack_41c = local_480._4_4_ + (float)local_460._4_4_;
        fStack_418 = local_480._8_4_ + fStack_458;
        fStack_414 = local_480._12_4_ + fStack_454;
        fStack_410 = local_480._16_4_ + fStack_450;
        fStack_40c = local_480._20_4_ + fStack_44c;
        fStack_408 = local_480._24_4_ + fStack_448;
        fStack_404 = local_480._28_4_ + fStack_444;
        for (bVar68 = (byte)uVar16 & bVar68; bVar68 != 0;
            bVar68 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar68 & (byte)uVar16) {
          auVar151._8_4_ = 0x7f800000;
          auVar151._0_8_ = 0x7f8000007f800000;
          auVar151._12_4_ = 0x7f800000;
          auVar151._16_4_ = 0x7f800000;
          auVar151._20_4_ = 0x7f800000;
          auVar151._24_4_ = 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar151,local_480);
          auVar129._0_4_ =
               (uint)(bVar68 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
          bVar73 = (bool)(bVar68 >> 1 & 1);
          auVar129._4_4_ = (uint)bVar73 * auVar97._4_4_ | (uint)!bVar73 * 0x7f800000;
          bVar73 = (bool)(bVar68 >> 2 & 1);
          auVar129._8_4_ = (uint)bVar73 * auVar97._8_4_ | (uint)!bVar73 * 0x7f800000;
          bVar73 = (bool)(bVar68 >> 3 & 1);
          auVar129._12_4_ = (uint)bVar73 * auVar97._12_4_ | (uint)!bVar73 * 0x7f800000;
          bVar73 = (bool)(bVar68 >> 4 & 1);
          auVar129._16_4_ = (uint)bVar73 * auVar97._16_4_ | (uint)!bVar73 * 0x7f800000;
          bVar73 = (bool)(bVar68 >> 5 & 1);
          auVar129._20_4_ = (uint)bVar73 * auVar97._20_4_ | (uint)!bVar73 * 0x7f800000;
          auVar129._24_4_ =
               (uint)(bVar68 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar97 = vshufps_avx(auVar129,auVar129,0xb1);
          auVar97 = vminps_avx(auVar129,auVar97);
          auVar86 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar86);
          auVar86 = vpermpd_avx2(auVar97,0x4e);
          auVar97 = vminps_avx(auVar97,auVar86);
          uVar16 = vcmpps_avx512vl(auVar129,auVar97,0);
          bVar67 = (byte)uVar16 & bVar68;
          bVar70 = bVar68;
          if (bVar67 != 0) {
            bVar70 = bVar67;
          }
          iVar19 = 0;
          for (uVar75 = (uint)bVar70; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
            iVar19 = iVar19 + 1;
          }
          auVar234 = ZEXT464(*(uint *)(local_200 + (uint)(iVar19 << 2)));
          fVar140 = local_8a8;
          auVar78 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
          if ((float)local_740._0_4_ < 0.0) {
            local_840._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
            local_860._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar19 << 2)));
            auVar239 = ZEXT1664(auVar239._0_16_);
            auVar244 = ZEXT1664(auVar244._0_16_);
            auVar245 = ZEXT1664(auVar245._0_16_);
            fVar140 = sqrtf((float)local_740._0_4_);
            auVar234 = ZEXT1664(local_860._0_16_);
            auVar253 = ZEXT3264(local_8a0);
            auVar252 = ZEXT3264(local_880);
            auVar78 = local_840._0_16_;
          }
          auVar76 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar79 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar80 = vminps_avx(local_6e0._0_16_,local_720._0_16_);
          auVar81 = vminps_avx(auVar76,auVar80);
          auVar76 = vmaxps_avx(local_6e0._0_16_,local_720._0_16_);
          auVar80 = vmaxps_avx(auVar79,auVar76);
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar79 = vandps_avx(auVar81,auVar190);
          auVar76 = vandps_avx(auVar80,auVar190);
          auVar79 = vmaxps_avx(auVar79,auVar76);
          auVar76 = vmovshdup_avx(auVar79);
          auVar76 = vmaxss_avx(auVar76,auVar79);
          auVar79 = vshufpd_avx(auVar79,auVar79,1);
          auVar79 = vmaxss_avx(auVar79,auVar76);
          fVar189 = auVar79._0_4_ * 1.9073486e-06;
          local_660 = vshufps_avx(auVar80,auVar80,0xff);
          auVar78 = vinsertps_avx(auVar234._0_16_,auVar78,0x10);
          auVar223 = ZEXT1664(auVar78);
          lVar72 = 5;
          do {
            do {
              bVar73 = lVar72 == 0;
              lVar72 = lVar72 + -1;
              if (bVar73) goto LAB_01a3e822;
              uVar155 = auVar223._0_4_;
              auVar141._4_4_ = uVar155;
              auVar141._0_4_ = uVar155;
              auVar141._8_4_ = uVar155;
              auVar141._12_4_ = uVar155;
              auVar78 = vfmadd132ps_fma(auVar141,ZEXT816(0) << 0x40,local_730);
              auVar79 = vmovshdup_avx(auVar223._0_16_);
              fVar227 = auVar79._0_4_;
              fVar188 = 1.0 - fVar227;
              fVar207 = fVar227 * fVar227;
              auVar82 = SUB6416(ZEXT464(0x40400000),0);
              auVar77 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar80 = vfmadd213ss_fma(auVar82,auVar79,auVar77);
              auVar76 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar207),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar81 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar188),auVar77);
              auVar81 = vfmadd213ss_fma(auVar81,ZEXT416((uint)(fVar188 * fVar188)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar208 = fVar188 * fVar188 * -fVar227 * 0.5;
              fVar209 = auVar76._0_4_ * 0.5;
              fVar210 = auVar81._0_4_ * 0.5;
              fVar211 = fVar227 * fVar227 * -fVar188 * 0.5;
              auVar191._0_4_ = fVar211 * (float)local_720._0_4_;
              auVar191._4_4_ = fVar211 * (float)local_720._4_4_;
              auVar191._8_4_ = fVar211 * fStack_718;
              auVar191._12_4_ = fVar211 * fStack_714;
              auVar212._4_4_ = fVar210;
              auVar212._0_4_ = fVar210;
              auVar212._8_4_ = fVar210;
              auVar212._12_4_ = fVar210;
              auVar76 = vfmadd132ps_fma(auVar212,auVar191,local_6e0._0_16_);
              auVar173._4_4_ = fVar209;
              auVar173._0_4_ = fVar209;
              auVar173._8_4_ = fVar209;
              auVar173._12_4_ = fVar209;
              auVar76 = vfmadd132ps_fma(auVar173,auVar76,local_700._0_16_);
              auVar192._4_4_ = fVar208;
              auVar192._0_4_ = fVar208;
              auVar192._8_4_ = fVar208;
              auVar192._12_4_ = fVar208;
              auVar76 = vfmadd132ps_fma(auVar192,auVar76,local_6c0._0_16_);
              auVar81 = vfmadd231ss_fma(auVar77,auVar79,ZEXT416(0x41100000));
              local_5c0._0_16_ = auVar81;
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar79,ZEXT416(0x40800000));
              local_5e0._0_16_ = auVar81;
              auVar81 = vfmadd213ss_fma(auVar82,auVar79,ZEXT416(0xbf800000));
              local_600._0_16_ = auVar81;
              local_5a0._0_16_ = auVar76;
              auVar76 = vsubps_avx(auVar78,auVar76);
              auVar78 = vdpps_avx(auVar76,auVar76,0x7f);
              local_6a0._0_16_ = auVar223._0_16_;
              local_840._0_16_ = auVar76;
              local_860._0_16_ = auVar78;
              if (auVar78._0_4_ < 0.0) {
                local_7c0._0_4_ = auVar80._0_4_;
                _local_7e0 = ZEXT416((uint)fVar188);
                local_760._0_4_ = fVar207;
                local_780._0_4_ = fVar188 * -2.0;
                auVar244._0_4_ = sqrtf(auVar78._0_4_);
                auVar244._4_60_ = extraout_var;
                auVar80 = ZEXT416((uint)local_7c0._0_4_);
                auVar78 = auVar244._0_16_;
                auVar76 = _local_7e0;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                local_780._0_4_ = fVar188 * -2.0;
                local_760._0_4_ = fVar207;
                auVar76 = ZEXT416((uint)fVar188);
              }
              fVar207 = auVar76._0_4_;
              auVar77 = vfnmadd231ss_fma(ZEXT416((uint)(fVar227 * (fVar207 + fVar207))),auVar76,
                                         auVar76);
              auVar76 = vfmadd213ss_fma(auVar80,ZEXT416((uint)(fVar227 + fVar227)),
                                        ZEXT416((uint)(fVar227 * fVar227 * 3.0)));
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * fVar207 * -3.0)),
                                        ZEXT416((uint)(fVar207 + fVar207)),auVar80);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)local_780._0_4_),auVar79,
                                        ZEXT416((uint)local_760._0_4_));
              fVar207 = auVar77._0_4_ * 0.5;
              fVar208 = auVar76._0_4_ * 0.5;
              fVar209 = auVar81._0_4_ * 0.5;
              fVar210 = auVar80._0_4_ * 0.5;
              auVar193._0_4_ = fVar210 * (float)local_720._0_4_;
              auVar193._4_4_ = fVar210 * (float)local_720._4_4_;
              auVar193._8_4_ = fVar210 * fStack_718;
              auVar193._12_4_ = fVar210 * fStack_714;
              auVar174._4_4_ = fVar209;
              auVar174._0_4_ = fVar209;
              auVar174._8_4_ = fVar209;
              auVar174._12_4_ = fVar209;
              auVar76 = vfmadd132ps_fma(auVar174,auVar193,local_6e0._0_16_);
              auVar157._4_4_ = fVar208;
              auVar157._0_4_ = fVar208;
              auVar157._8_4_ = fVar208;
              auVar157._12_4_ = fVar208;
              auVar76 = vfmadd132ps_fma(auVar157,auVar76,local_700._0_16_);
              auVar247._4_4_ = fVar207;
              auVar247._0_4_ = fVar207;
              auVar247._8_4_ = fVar207;
              auVar247._12_4_ = fVar207;
              local_7c0._0_16_ = vfmadd132ps_fma(auVar247,auVar76,local_6c0._0_16_);
              local_760._0_16_ = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
              auVar56._12_4_ = 0;
              auVar56._0_12_ = ZEXT812(0);
              fVar207 = local_760._0_4_;
              auVar76 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar207));
              fVar208 = auVar76._0_4_;
              local_780._0_16_ = vrcp14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar207));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(local_760._0_16_,auVar20);
              auVar76 = vfnmadd213ss_fma(local_780._0_16_,local_760._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_620._0_4_ = auVar76._0_4_;
              local_7e0._0_4_ = auVar78._0_4_;
              if (fVar207 < auVar80._0_4_) {
                fVar209 = sqrtf(fVar207);
                auVar78 = ZEXT416((uint)local_7e0._0_4_);
                auVar76 = local_7c0._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(local_760._0_16_,local_760._0_16_);
                fVar209 = auVar76._0_4_;
                auVar76 = local_7c0._0_16_;
              }
              fVar207 = fVar208 * 1.5 + fVar207 * -0.5 * fVar208 * fVar208 * fVar208;
              auVar213._0_4_ = auVar76._0_4_ * fVar207;
              auVar213._4_4_ = auVar76._4_4_ * fVar207;
              auVar213._8_4_ = auVar76._8_4_ * fVar207;
              auVar213._12_4_ = auVar76._12_4_ * fVar207;
              auVar80 = vdpps_avx(local_840._0_16_,auVar213,0x7f);
              fVar211 = auVar78._0_4_;
              fVar208 = auVar80._0_4_;
              auVar142._0_4_ = fVar208 * fVar208;
              auVar142._4_4_ = auVar80._4_4_ * auVar80._4_4_;
              auVar142._8_4_ = auVar80._8_4_ * auVar80._8_4_;
              auVar142._12_4_ = auVar80._12_4_ * auVar80._12_4_;
              auVar81 = vsubps_avx512vl(local_860._0_16_,auVar142);
              fVar210 = auVar81._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar210;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              auVar82 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
              if (fVar210 < 0.0) {
                local_650 = fVar207;
                fStack_64c = fVar207;
                fStack_648 = fVar207;
                fStack_644 = fVar207;
                local_640 = auVar213;
                local_630 = auVar77;
                fVar210 = sqrtf(fVar210);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar78 = ZEXT416((uint)local_7e0._0_4_);
                auVar213 = local_640;
                auVar81 = local_630;
                auVar76 = local_7c0._0_16_;
                fVar207 = local_650;
                fVar188 = fStack_64c;
                fVar227 = fStack_648;
                fVar228 = fStack_644;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar210 = auVar81._0_4_;
                auVar81 = auVar77;
                fVar188 = fVar207;
                fVar227 = fVar207;
                fVar228 = fVar207;
              }
              auVar244 = ZEXT1664(local_840._0_16_);
              auVar252 = ZEXT3264(local_880);
              auVar253 = ZEXT3264(local_8a0);
              auVar159._0_4_ = (float)local_600._0_4_ * (float)local_720._0_4_;
              auVar159._4_4_ = (float)local_600._0_4_ * (float)local_720._4_4_;
              auVar159._8_4_ = (float)local_600._0_4_ * fStack_718;
              auVar159._12_4_ = (float)local_600._0_4_ * fStack_714;
              auVar175._4_4_ = local_5e0._0_4_;
              auVar175._0_4_ = local_5e0._0_4_;
              auVar175._8_4_ = local_5e0._0_4_;
              auVar175._12_4_ = local_5e0._0_4_;
              auVar2 = vfmadd132ps_fma(auVar175,auVar159,local_6e0._0_16_);
              auVar160._4_4_ = local_5c0._0_4_;
              auVar160._0_4_ = local_5c0._0_4_;
              auVar160._8_4_ = local_5c0._0_4_;
              auVar160._12_4_ = local_5c0._0_4_;
              auVar2 = vfmadd132ps_fma(auVar160,auVar2,local_700._0_16_);
              auVar79 = vfmadd213ss_fma(auVar79,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar155 = auVar79._0_4_;
              auVar176._4_4_ = uVar155;
              auVar176._0_4_ = uVar155;
              auVar176._8_4_ = uVar155;
              auVar176._12_4_ = uVar155;
              auVar79 = vfmadd132ps_fma(auVar176,auVar2,local_6c0._0_16_);
              auVar161._0_4_ = auVar79._0_4_ * (float)local_760._0_4_;
              auVar161._4_4_ = auVar79._4_4_ * (float)local_760._0_4_;
              auVar161._8_4_ = auVar79._8_4_ * (float)local_760._0_4_;
              auVar161._12_4_ = auVar79._12_4_ * (float)local_760._0_4_;
              auVar79 = vdpps_avx(auVar76,auVar79,0x7f);
              fVar172 = auVar79._0_4_;
              auVar177._0_4_ = auVar76._0_4_ * fVar172;
              auVar177._4_4_ = auVar76._4_4_ * fVar172;
              auVar177._8_4_ = auVar76._8_4_ * fVar172;
              auVar177._12_4_ = auVar76._12_4_ * fVar172;
              auVar79 = vsubps_avx(auVar161,auVar177);
              fVar172 = (float)local_620._0_4_ * (float)local_780._0_4_;
              auVar2 = vmaxss_avx(ZEXT416((uint)fVar189),
                                  ZEXT416((uint)(local_6a0._0_4_ * fVar140 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar130._16_16_ = local_8a0._16_16_;
              auVar83 = vxorps_avx512vl(auVar76,auVar21);
              auVar178._0_4_ = fVar207 * auVar79._0_4_ * fVar172;
              auVar178._4_4_ = fVar188 * auVar79._4_4_ * fVar172;
              auVar178._8_4_ = fVar227 * auVar79._8_4_ * fVar172;
              auVar178._12_4_ = fVar228 * auVar79._12_4_ * fVar172;
              auVar79 = vdpps_avx(auVar83,auVar213,0x7f);
              auVar3 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar189),auVar2);
              auVar78 = vdpps_avx(local_840._0_16_,auVar178,0x7f);
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar211 + 1.0)),
                                       ZEXT416((uint)(fVar189 / fVar209)),auVar3);
              fVar207 = auVar79._0_4_ + auVar78._0_4_;
              auVar245 = ZEXT464((uint)fVar207);
              auVar78 = vdpps_avx(local_730,auVar213,0x7f);
              auVar79 = vdpps_avx(local_840._0_16_,auVar83,0x7f);
              auVar82 = vmulss_avx512f(auVar82,auVar81);
              fVar209 = auVar77._0_4_ * 1.5 + auVar82._0_4_ * auVar81._0_4_ * auVar81._0_4_;
              auVar81 = vdpps_avx(local_840._0_16_,local_730,0x7f);
              auVar82 = vfnmadd231ss_fma(auVar79,auVar80,ZEXT416((uint)fVar207));
              auVar81 = vfnmadd231ss_fma(auVar81,auVar80,auVar78);
              auVar79 = vpermilps_avx(local_5a0._0_16_,0xff);
              fVar210 = fVar210 - auVar79._0_4_;
              auVar77 = vshufps_avx(auVar76,auVar76,0xff);
              auVar79 = vfmsub213ss_fma(auVar82,ZEXT416((uint)fVar209),auVar77);
              auVar236._8_4_ = 0x80000000;
              auVar236._0_8_ = 0x8000000080000000;
              auVar236._12_4_ = 0x80000000;
              auVar239 = ZEXT1664(auVar236);
              auVar231._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar231._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar231._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar234 = ZEXT1664(auVar231);
              auVar81 = ZEXT416((uint)(auVar81._0_4_ * fVar209));
              auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar207),auVar81);
              auVar79 = vinsertps_avx(auVar231,auVar81,0x1c);
              auVar219._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar219._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar219._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar207),auVar219,0x10);
              auVar194._0_4_ = auVar82._0_4_;
              auVar194._4_4_ = auVar194._0_4_;
              auVar194._8_4_ = auVar194._0_4_;
              auVar194._12_4_ = auVar194._0_4_;
              auVar78 = vdivps_avx(auVar79,auVar194);
              auVar79 = vdivps_avx(auVar81,auVar194);
              auVar195._0_4_ = fVar208 * auVar78._0_4_ + fVar210 * auVar79._0_4_;
              auVar195._4_4_ = fVar208 * auVar78._4_4_ + fVar210 * auVar79._4_4_;
              auVar195._8_4_ = fVar208 * auVar78._8_4_ + fVar210 * auVar79._8_4_;
              auVar195._12_4_ = fVar208 * auVar78._12_4_ + fVar210 * auVar79._12_4_;
              auVar78 = vsubps_avx(local_6a0._0_16_,auVar195);
              auVar223 = ZEXT1664(auVar78);
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(auVar80,auVar22);
            } while (auVar3._0_4_ <= auVar79._0_4_);
            auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar2._0_4_)),local_660,
                                      ZEXT416(0x36000000));
            auVar23._8_4_ = 0x7fffffff;
            auVar23._0_8_ = 0x7fffffff7fffffff;
            auVar23._12_4_ = 0x7fffffff;
            auVar80 = vandps_avx512vl(ZEXT416((uint)fVar210),auVar23);
          } while (auVar79._0_4_ <= auVar80._0_4_);
          fVar140 = auVar78._0_4_ + (float)local_670._0_4_;
          if ((fVar1 <= fVar140) && (fVar189 = *(float *)(ray + k * 4 + 0x80), fVar140 <= fVar189))
          {
            auVar79 = vmovshdup_avx(auVar78);
            fVar208 = auVar79._0_4_;
            if ((0.0 <= fVar208) && (fVar208 <= 1.0)) {
              auVar57._12_4_ = 0;
              auVar57._0_12_ = ZEXT412(0);
              auVar130._4_12_ = ZEXT412(0);
              auVar130._0_4_ = local_860._0_4_;
              auVar79 = vrsqrt14ss_avx512f(auVar57 << 0x20,auVar130._0_16_);
              fVar209 = auVar79._0_4_;
              auVar79 = vmulss_avx512f(local_860._0_16_,ZEXT416(0xbf000000));
              pGVar7 = (context->scene->geometries).items[uVar4].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar209 = fVar209 * 1.5 + auVar79._0_4_ * fVar209 * fVar209 * fVar209;
                auVar196._0_4_ = local_840._0_4_ * fVar209;
                auVar196._4_4_ = local_840._4_4_ * fVar209;
                auVar196._8_4_ = local_840._8_4_ * fVar209;
                auVar196._12_4_ = local_840._12_4_ * fVar209;
                auVar81 = vfmadd213ps_fma(auVar77,auVar196,auVar76);
                auVar79 = vshufps_avx(auVar196,auVar196,0xc9);
                auVar80 = vshufps_avx(auVar76,auVar76,0xc9);
                auVar197._0_4_ = auVar196._0_4_ * auVar80._0_4_;
                auVar197._4_4_ = auVar196._4_4_ * auVar80._4_4_;
                auVar197._8_4_ = auVar196._8_4_ * auVar80._8_4_;
                auVar197._12_4_ = auVar196._12_4_ * auVar80._12_4_;
                auVar80 = vfmsub231ps_fma(auVar197,auVar76,auVar79);
                auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                auVar76 = vshufps_avx(auVar81,auVar81,0xc9);
                auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                auVar143._0_4_ = auVar81._0_4_ * auVar80._0_4_;
                auVar143._4_4_ = auVar81._4_4_ * auVar80._4_4_;
                auVar143._8_4_ = auVar81._8_4_ * auVar80._8_4_;
                auVar143._12_4_ = auVar81._12_4_ * auVar80._12_4_;
                auVar79 = vfmsub231ps_fma(auVar143,auVar79,auVar76);
                uVar155 = auVar79._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar140;
                  uVar6 = vextractps_avx(auVar79,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
                  uVar6 = vextractps_avx(auVar79,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar155;
                  *(float *)(ray + k * 4 + 0xf0) = fVar208;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = uVar5;
                  *(uint *)(ray + k * 4 + 0x120) = uVar4;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_510 = vshufps_avx(auVar78,auVar78,0x55);
                  local_540 = (RTCHitN  [16])vshufps_avx(auVar79,auVar79,0x55);
                  auStack_530 = vshufps_avx(auVar79,auVar79,0xaa);
                  local_520 = uVar155;
                  uStack_51c = uVar155;
                  uStack_518 = uVar155;
                  uStack_514 = uVar155;
                  local_500 = ZEXT416(0) << 0x20;
                  local_4f0 = local_560._0_8_;
                  uStack_4e8 = local_560._8_8_;
                  local_4e0 = local_550;
                  vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                  uStack_4cc = context->user->instID[0];
                  local_4d0 = uStack_4cc;
                  uStack_4c8 = uStack_4cc;
                  uStack_4c4 = uStack_4cc;
                  uStack_4c0 = context->user->instPrimID[0];
                  uStack_4bc = uStack_4c0;
                  uStack_4b8 = uStack_4c0;
                  uStack_4b4 = uStack_4c0;
                  *(float *)(ray + k * 4 + 0x80) = fVar140;
                  local_8c0 = local_570;
                  local_810.valid = (int *)local_8c0;
                  local_810.geometryUserPtr = pGVar7->userPtr;
                  local_810.context = context->user;
                  local_810.hit = local_540;
                  local_810.N = 4;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar234 = ZEXT1664(auVar231);
                    auVar239 = ZEXT1664(auVar236);
                    auVar244 = ZEXT1664(local_840._0_16_);
                    auVar245 = ZEXT1664(ZEXT416((uint)fVar207));
                    (*pGVar7->intersectionFilterN)(&local_810);
                    auVar253 = ZEXT3264(local_8a0);
                    auVar252 = ZEXT3264(local_880);
                  }
                  uVar74 = vptestmd_avx512vl(local_8c0,local_8c0);
                  if ((uVar74 & 0xf) != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      auVar239 = ZEXT1664(auVar239._0_16_);
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      (*p_Var8)(&local_810);
                      auVar253 = ZEXT3264(local_8a0);
                      auVar252 = ZEXT3264(local_880);
                    }
                    uVar74 = vptestmd_avx512vl(local_8c0,local_8c0);
                    uVar74 = uVar74 & 0xf;
                    bVar70 = (byte)uVar74;
                    if (bVar70 != 0) {
                      iVar60 = *(int *)(local_810.hit + 4);
                      iVar61 = *(int *)(local_810.hit + 8);
                      iVar62 = *(int *)(local_810.hit + 0xc);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0xc0) =
                           (uint)(bVar70 & 1) * *(int *)local_810.hit |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_810.ray + 0xc0);
                      *(uint *)(local_810.ray + 0xc4) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0xc4);
                      *(uint *)(local_810.ray + 200) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 200);
                      *(uint *)(local_810.ray + 0xcc) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0xcc);
                      iVar60 = *(int *)(local_810.hit + 0x14);
                      iVar61 = *(int *)(local_810.hit + 0x18);
                      iVar62 = *(int *)(local_810.hit + 0x1c);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0xd0) =
                           (uint)(bVar70 & 1) * *(int *)(local_810.hit + 0x10) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_810.ray + 0xd0);
                      *(uint *)(local_810.ray + 0xd4) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0xd4);
                      *(uint *)(local_810.ray + 0xd8) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 0xd8);
                      *(uint *)(local_810.ray + 0xdc) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0xdc);
                      iVar60 = *(int *)(local_810.hit + 0x24);
                      iVar61 = *(int *)(local_810.hit + 0x28);
                      iVar62 = *(int *)(local_810.hit + 0x2c);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0xe0) =
                           (uint)(bVar70 & 1) * *(int *)(local_810.hit + 0x20) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_810.ray + 0xe0);
                      *(uint *)(local_810.ray + 0xe4) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0xe4);
                      *(uint *)(local_810.ray + 0xe8) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 0xe8);
                      *(uint *)(local_810.ray + 0xec) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0xec);
                      iVar60 = *(int *)(local_810.hit + 0x34);
                      iVar61 = *(int *)(local_810.hit + 0x38);
                      iVar62 = *(int *)(local_810.hit + 0x3c);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0xf0) =
                           (uint)(bVar70 & 1) * *(int *)(local_810.hit + 0x30) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_810.ray + 0xf0);
                      *(uint *)(local_810.ray + 0xf4) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0xf4);
                      *(uint *)(local_810.ray + 0xf8) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 0xf8);
                      *(uint *)(local_810.ray + 0xfc) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0xfc);
                      iVar60 = *(int *)(local_810.hit + 0x44);
                      iVar61 = *(int *)(local_810.hit + 0x48);
                      iVar62 = *(int *)(local_810.hit + 0x4c);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)(bVar70 & 1) * *(int *)(local_810.hit + 0x40) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0x10c);
                      auVar78 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar78;
                      auVar78 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar78;
                      auVar78 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar78;
                      auVar78 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar78;
                      goto LAB_01a3e822;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar189;
                }
              }
            }
          }
LAB_01a3e822:
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar221._4_4_ = uVar155;
          auVar221._0_4_ = uVar155;
          auVar221._8_4_ = uVar155;
          auVar221._12_4_ = uVar155;
          auVar221._16_4_ = uVar155;
          auVar221._20_4_ = uVar155;
          auVar221._24_4_ = uVar155;
          auVar221._28_4_ = uVar155;
          auVar223 = ZEXT3264(auVar221);
          auVar63._4_4_ = fStack_41c;
          auVar63._0_4_ = local_420;
          auVar63._8_4_ = fStack_418;
          auVar63._12_4_ = fStack_414;
          auVar63._16_4_ = fStack_410;
          auVar63._20_4_ = fStack_40c;
          auVar63._24_4_ = fStack_408;
          auVar63._28_4_ = fStack_404;
          uVar16 = vcmpps_avx512vl(auVar221,auVar63,0xd);
        }
        auVar152._0_4_ = (float)local_460._0_4_ + (float)local_440._0_4_;
        auVar152._4_4_ = (float)local_460._4_4_ + (float)local_440._4_4_;
        auVar152._8_4_ = fStack_458 + fStack_438;
        auVar152._12_4_ = fStack_454 + fStack_434;
        auVar152._16_4_ = fStack_450 + fStack_430;
        auVar152._20_4_ = fStack_44c + fStack_42c;
        auVar152._24_4_ = fStack_448 + fStack_428;
        auVar152._28_4_ = fStack_444 + fStack_424;
        uVar155 = auVar223._0_4_;
        auVar170._4_4_ = uVar155;
        auVar170._0_4_ = uVar155;
        auVar170._8_4_ = uVar155;
        auVar170._12_4_ = uVar155;
        auVar170._16_4_ = uVar155;
        auVar170._20_4_ = uVar155;
        auVar170._24_4_ = uVar155;
        auVar170._28_4_ = uVar155;
        uVar16 = vcmpps_avx512vl(auVar152,auVar170,2);
        auVar153._8_4_ = 2;
        auVar153._0_8_ = 0x200000002;
        auVar153._12_4_ = 2;
        auVar153._16_4_ = 2;
        auVar153._20_4_ = 2;
        auVar153._24_4_ = 2;
        auVar153._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar153,auVar32);
        bVar73 = (bool)((byte)local_8b0 & 1);
        local_440._0_4_ = (uint)bVar73 * auVar97._0_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)((byte)(local_8b0 >> 1) & 1);
        local_440._4_4_ = (uint)bVar73 * auVar97._4_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)((byte)(local_8b0 >> 2) & 1);
        fStack_438 = (float)((uint)bVar73 * auVar97._8_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)((byte)(local_8b0 >> 3) & 1);
        fStack_434 = (float)((uint)bVar73 * auVar97._12_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)((byte)(local_8b0 >> 4) & 1);
        fStack_430 = (float)((uint)bVar73 * auVar97._16_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)((byte)(local_8b0 >> 5) & 1);
        fStack_42c = (float)((uint)bVar73 * auVar97._20_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)((byte)(local_8b0 >> 6) & 1);
        fStack_428 = (float)((uint)bVar73 * auVar97._24_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)((byte)(local_8b0 >> 7) & 1);
        fStack_424 = (float)((uint)bVar73 * auVar97._28_4_ | (uint)!bVar73 * 2);
        bVar66 = (byte)uVar17 & bVar66 & (byte)uVar16;
        uVar16 = vpcmpd_avx512vl(_local_440,local_3e0,2);
        local_480 = _local_3a0;
        local_420 = (float)local_460._0_4_ + (float)local_3a0._0_4_;
        fStack_41c = (float)local_460._4_4_ + (float)local_3a0._4_4_;
        fStack_418 = fStack_458 + fStack_398;
        fStack_414 = fStack_454 + fStack_394;
        fStack_410 = fStack_450 + fStack_390;
        fStack_40c = fStack_44c + fStack_38c;
        fStack_408 = fStack_448 + fStack_388;
        fStack_404 = fStack_444 + fStack_384;
        for (bVar70 = (byte)uVar16 & bVar66; bVar70 != 0;
            bVar70 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar70 & (byte)uVar16) {
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar154,local_480);
          auVar131._0_4_ =
               (uint)(bVar70 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
          bVar73 = (bool)(bVar70 >> 1 & 1);
          auVar131._4_4_ = (uint)bVar73 * auVar97._4_4_ | (uint)!bVar73 * 0x7f800000;
          bVar73 = (bool)(bVar70 >> 2 & 1);
          auVar131._8_4_ = (uint)bVar73 * auVar97._8_4_ | (uint)!bVar73 * 0x7f800000;
          bVar73 = (bool)(bVar70 >> 3 & 1);
          auVar131._12_4_ = (uint)bVar73 * auVar97._12_4_ | (uint)!bVar73 * 0x7f800000;
          bVar73 = (bool)(bVar70 >> 4 & 1);
          auVar131._16_4_ = (uint)bVar73 * auVar97._16_4_ | (uint)!bVar73 * 0x7f800000;
          bVar73 = (bool)(bVar70 >> 5 & 1);
          auVar131._20_4_ = (uint)bVar73 * auVar97._20_4_ | (uint)!bVar73 * 0x7f800000;
          auVar131._24_4_ =
               (uint)(bVar70 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar70 >> 6) * 0x7f800000;
          auVar131._28_4_ = 0x7f800000;
          auVar97 = vshufps_avx(auVar131,auVar131,0xb1);
          auVar97 = vminps_avx(auVar131,auVar97);
          auVar86 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar86);
          auVar86 = vpermpd_avx2(auVar97,0x4e);
          auVar97 = vminps_avx(auVar97,auVar86);
          uVar16 = vcmpps_avx512vl(auVar131,auVar97,0);
          bVar67 = (byte)uVar16 & bVar70;
          bVar68 = bVar70;
          if (bVar67 != 0) {
            bVar68 = bVar67;
          }
          iVar19 = 0;
          for (uVar75 = (uint)bVar68; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
            iVar19 = iVar19 + 1;
          }
          auVar234 = ZEXT464(*(uint *)(local_380 + (uint)(iVar19 << 2)));
          fVar140 = local_8a4;
          auVar78 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
          if ((float)local_740._0_4_ < 0.0) {
            local_840._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
            local_860._0_16_ = ZEXT416(*(uint *)(local_380 + (uint)(iVar19 << 2)));
            auVar239 = ZEXT1664(auVar239._0_16_);
            auVar244 = ZEXT1664(auVar244._0_16_);
            auVar245 = ZEXT1664(auVar245._0_16_);
            fVar140 = sqrtf((float)local_740._0_4_);
            auVar234 = ZEXT1664(local_860._0_16_);
            auVar253 = ZEXT3264(local_8a0);
            auVar252 = ZEXT3264(local_880);
            auVar78 = local_840._0_16_;
          }
          auVar76 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar79 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar80 = vminps_avx(local_6e0._0_16_,local_720._0_16_);
          auVar81 = vminps_avx(auVar76,auVar80);
          auVar76 = vmaxps_avx(local_6e0._0_16_,local_720._0_16_);
          auVar80 = vmaxps_avx(auVar79,auVar76);
          auVar198._8_4_ = 0x7fffffff;
          auVar198._0_8_ = 0x7fffffff7fffffff;
          auVar198._12_4_ = 0x7fffffff;
          auVar79 = vandps_avx(auVar81,auVar198);
          auVar76 = vandps_avx(auVar80,auVar198);
          auVar79 = vmaxps_avx(auVar79,auVar76);
          auVar76 = vmovshdup_avx(auVar79);
          auVar76 = vmaxss_avx(auVar76,auVar79);
          auVar79 = vshufpd_avx(auVar79,auVar79,1);
          auVar79 = vmaxss_avx(auVar79,auVar76);
          fVar189 = auVar79._0_4_ * 1.9073486e-06;
          local_660 = vshufps_avx(auVar80,auVar80,0xff);
          auVar78 = vinsertps_avx(auVar234._0_16_,auVar78,0x10);
          auVar223 = ZEXT1664(auVar78);
          lVar72 = 5;
          do {
            do {
              bVar73 = lVar72 == 0;
              lVar72 = lVar72 + -1;
              if (bVar73) goto LAB_01a3f556;
              uVar155 = auVar223._0_4_;
              auVar144._4_4_ = uVar155;
              auVar144._0_4_ = uVar155;
              auVar144._8_4_ = uVar155;
              auVar144._12_4_ = uVar155;
              auVar78 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_730);
              auVar79 = vmovshdup_avx(auVar223._0_16_);
              fVar227 = auVar79._0_4_;
              fVar188 = 1.0 - fVar227;
              fVar207 = fVar227 * fVar227;
              auVar82 = SUB6416(ZEXT464(0x40400000),0);
              auVar77 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar80 = vfmadd213ss_fma(auVar82,auVar79,auVar77);
              auVar76 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar207),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar81 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar188),auVar77);
              auVar81 = vfmadd213ss_fma(auVar81,ZEXT416((uint)(fVar188 * fVar188)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar208 = fVar188 * fVar188 * -fVar227 * 0.5;
              fVar209 = auVar76._0_4_ * 0.5;
              fVar210 = auVar81._0_4_ * 0.5;
              fVar211 = fVar227 * fVar227 * -fVar188 * 0.5;
              auVar199._0_4_ = fVar211 * (float)local_720._0_4_;
              auVar199._4_4_ = fVar211 * (float)local_720._4_4_;
              auVar199._8_4_ = fVar211 * fStack_718;
              auVar199._12_4_ = fVar211 * fStack_714;
              auVar214._4_4_ = fVar210;
              auVar214._0_4_ = fVar210;
              auVar214._8_4_ = fVar210;
              auVar214._12_4_ = fVar210;
              auVar76 = vfmadd132ps_fma(auVar214,auVar199,local_6e0._0_16_);
              auVar179._4_4_ = fVar209;
              auVar179._0_4_ = fVar209;
              auVar179._8_4_ = fVar209;
              auVar179._12_4_ = fVar209;
              auVar76 = vfmadd132ps_fma(auVar179,auVar76,local_700._0_16_);
              auVar200._4_4_ = fVar208;
              auVar200._0_4_ = fVar208;
              auVar200._8_4_ = fVar208;
              auVar200._12_4_ = fVar208;
              auVar76 = vfmadd132ps_fma(auVar200,auVar76,local_6c0._0_16_);
              auVar81 = vfmadd231ss_fma(auVar77,auVar79,ZEXT416(0x41100000));
              local_5c0._0_16_ = auVar81;
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar79,ZEXT416(0x40800000));
              local_5e0._0_16_ = auVar81;
              auVar81 = vfmadd213ss_fma(auVar82,auVar79,ZEXT416(0xbf800000));
              local_600._0_16_ = auVar81;
              local_5a0._0_16_ = auVar76;
              auVar76 = vsubps_avx(auVar78,auVar76);
              auVar78 = vdpps_avx(auVar76,auVar76,0x7f);
              local_6a0._0_16_ = auVar223._0_16_;
              local_840._0_16_ = auVar76;
              local_860._0_16_ = auVar78;
              if (auVar78._0_4_ < 0.0) {
                local_7c0._0_4_ = auVar80._0_4_;
                _local_7e0 = ZEXT416((uint)fVar188);
                local_760._0_4_ = fVar207;
                local_780._0_4_ = fVar188 * -2.0;
                auVar245._0_4_ = sqrtf(auVar78._0_4_);
                auVar245._4_60_ = extraout_var_00;
                auVar80 = ZEXT416((uint)local_7c0._0_4_);
                auVar78 = auVar245._0_16_;
                auVar76 = _local_7e0;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                local_780._0_4_ = fVar188 * -2.0;
                local_760._0_4_ = fVar207;
                auVar76 = ZEXT416((uint)fVar188);
              }
              fVar207 = auVar76._0_4_;
              auVar77 = vfnmadd231ss_fma(ZEXT416((uint)(fVar227 * (fVar207 + fVar207))),auVar76,
                                         auVar76);
              auVar76 = vfmadd213ss_fma(auVar80,ZEXT416((uint)(fVar227 + fVar227)),
                                        ZEXT416((uint)(fVar227 * fVar227 * 3.0)));
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * fVar207 * -3.0)),
                                        ZEXT416((uint)(fVar207 + fVar207)),auVar80);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)local_780._0_4_),auVar79,
                                        ZEXT416((uint)local_760._0_4_));
              fVar207 = auVar77._0_4_ * 0.5;
              fVar208 = auVar76._0_4_ * 0.5;
              fVar209 = auVar81._0_4_ * 0.5;
              fVar210 = auVar80._0_4_ * 0.5;
              auVar201._0_4_ = fVar210 * (float)local_720._0_4_;
              auVar201._4_4_ = fVar210 * (float)local_720._4_4_;
              auVar201._8_4_ = fVar210 * fStack_718;
              auVar201._12_4_ = fVar210 * fStack_714;
              auVar180._4_4_ = fVar209;
              auVar180._0_4_ = fVar209;
              auVar180._8_4_ = fVar209;
              auVar180._12_4_ = fVar209;
              auVar76 = vfmadd132ps_fma(auVar180,auVar201,local_6e0._0_16_);
              auVar162._4_4_ = fVar208;
              auVar162._0_4_ = fVar208;
              auVar162._8_4_ = fVar208;
              auVar162._12_4_ = fVar208;
              auVar76 = vfmadd132ps_fma(auVar162,auVar76,local_700._0_16_);
              auVar248._4_4_ = fVar207;
              auVar248._0_4_ = fVar207;
              auVar248._8_4_ = fVar207;
              auVar248._12_4_ = fVar207;
              local_7c0._0_16_ = vfmadd132ps_fma(auVar248,auVar76,local_6c0._0_16_);
              local_760._0_16_ = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
              auVar58._12_4_ = 0;
              auVar58._0_12_ = ZEXT812(0);
              fVar207 = local_760._0_4_;
              auVar76 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar207));
              fVar208 = auVar76._0_4_;
              local_780._0_16_ = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar207));
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(local_760._0_16_,auVar24);
              auVar76 = vfnmadd213ss_fma(local_780._0_16_,local_760._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_620._0_4_ = auVar76._0_4_;
              local_7e0._0_4_ = auVar78._0_4_;
              if (fVar207 < auVar80._0_4_) {
                fVar209 = sqrtf(fVar207);
                auVar78 = ZEXT416((uint)local_7e0._0_4_);
                auVar76 = local_7c0._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(local_760._0_16_,local_760._0_16_);
                fVar209 = auVar76._0_4_;
                auVar76 = local_7c0._0_16_;
              }
              fVar207 = fVar208 * 1.5 + fVar207 * -0.5 * fVar208 * fVar208 * fVar208;
              auVar215._0_4_ = auVar76._0_4_ * fVar207;
              auVar215._4_4_ = auVar76._4_4_ * fVar207;
              auVar215._8_4_ = auVar76._8_4_ * fVar207;
              auVar215._12_4_ = auVar76._12_4_ * fVar207;
              auVar80 = vdpps_avx(local_840._0_16_,auVar215,0x7f);
              fVar211 = auVar78._0_4_;
              fVar208 = auVar80._0_4_;
              auVar145._0_4_ = fVar208 * fVar208;
              auVar145._4_4_ = auVar80._4_4_ * auVar80._4_4_;
              auVar145._8_4_ = auVar80._8_4_ * auVar80._8_4_;
              auVar145._12_4_ = auVar80._12_4_ * auVar80._12_4_;
              auVar81 = vsubps_avx512vl(local_860._0_16_,auVar145);
              fVar210 = auVar81._0_4_;
              auVar163._4_12_ = ZEXT812(0) << 0x20;
              auVar163._0_4_ = fVar210;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
              auVar82 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
              if (fVar210 < 0.0) {
                local_650 = fVar207;
                fStack_64c = fVar207;
                fStack_648 = fVar207;
                fStack_644 = fVar207;
                local_640 = auVar215;
                local_630 = auVar77;
                fVar210 = sqrtf(fVar210);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar78 = ZEXT416((uint)local_7e0._0_4_);
                auVar215 = local_640;
                auVar81 = local_630;
                auVar76 = local_7c0._0_16_;
                fVar207 = local_650;
                fVar188 = fStack_64c;
                fVar227 = fStack_648;
                fVar228 = fStack_644;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar210 = auVar81._0_4_;
                auVar81 = auVar77;
                fVar188 = fVar207;
                fVar227 = fVar207;
                fVar228 = fVar207;
              }
              auVar244 = ZEXT1664(local_840._0_16_);
              auVar252 = ZEXT3264(local_880);
              auVar253 = ZEXT3264(local_8a0);
              auVar164._0_4_ = (float)local_600._0_4_ * (float)local_720._0_4_;
              auVar164._4_4_ = (float)local_600._0_4_ * (float)local_720._4_4_;
              auVar164._8_4_ = (float)local_600._0_4_ * fStack_718;
              auVar164._12_4_ = (float)local_600._0_4_ * fStack_714;
              auVar181._4_4_ = local_5e0._0_4_;
              auVar181._0_4_ = local_5e0._0_4_;
              auVar181._8_4_ = local_5e0._0_4_;
              auVar181._12_4_ = local_5e0._0_4_;
              auVar2 = vfmadd132ps_fma(auVar181,auVar164,local_6e0._0_16_);
              auVar165._4_4_ = local_5c0._0_4_;
              auVar165._0_4_ = local_5c0._0_4_;
              auVar165._8_4_ = local_5c0._0_4_;
              auVar165._12_4_ = local_5c0._0_4_;
              auVar2 = vfmadd132ps_fma(auVar165,auVar2,local_700._0_16_);
              auVar79 = vfmadd213ss_fma(auVar79,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar155 = auVar79._0_4_;
              auVar182._4_4_ = uVar155;
              auVar182._0_4_ = uVar155;
              auVar182._8_4_ = uVar155;
              auVar182._12_4_ = uVar155;
              auVar79 = vfmadd132ps_fma(auVar182,auVar2,local_6c0._0_16_);
              auVar166._0_4_ = auVar79._0_4_ * (float)local_760._0_4_;
              auVar166._4_4_ = auVar79._4_4_ * (float)local_760._0_4_;
              auVar166._8_4_ = auVar79._8_4_ * (float)local_760._0_4_;
              auVar166._12_4_ = auVar79._12_4_ * (float)local_760._0_4_;
              auVar79 = vdpps_avx(auVar76,auVar79,0x7f);
              fVar172 = auVar79._0_4_;
              auVar183._0_4_ = auVar76._0_4_ * fVar172;
              auVar183._4_4_ = auVar76._4_4_ * fVar172;
              auVar183._8_4_ = auVar76._8_4_ * fVar172;
              auVar183._12_4_ = auVar76._12_4_ * fVar172;
              auVar79 = vsubps_avx(auVar166,auVar183);
              fVar172 = (float)local_620._0_4_ * (float)local_780._0_4_;
              auVar2 = vmaxss_avx(ZEXT416((uint)fVar189),
                                  ZEXT416((uint)(local_6a0._0_4_ * fVar140 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar132._16_16_ = local_8a0._16_16_;
              auVar83 = vxorps_avx512vl(auVar76,auVar25);
              auVar184._0_4_ = fVar207 * auVar79._0_4_ * fVar172;
              auVar184._4_4_ = fVar188 * auVar79._4_4_ * fVar172;
              auVar184._8_4_ = fVar227 * auVar79._8_4_ * fVar172;
              auVar184._12_4_ = fVar228 * auVar79._12_4_ * fVar172;
              auVar79 = vdpps_avx(auVar83,auVar215,0x7f);
              auVar3 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar189),auVar2);
              auVar78 = vdpps_avx(local_840._0_16_,auVar184,0x7f);
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar211 + 1.0)),
                                       ZEXT416((uint)(fVar189 / fVar209)),auVar3);
              fVar207 = auVar79._0_4_ + auVar78._0_4_;
              auVar245 = ZEXT464((uint)fVar207);
              auVar78 = vdpps_avx(local_730,auVar215,0x7f);
              auVar79 = vdpps_avx(local_840._0_16_,auVar83,0x7f);
              auVar82 = vmulss_avx512f(auVar82,auVar81);
              fVar209 = auVar77._0_4_ * 1.5 + auVar82._0_4_ * auVar81._0_4_ * auVar81._0_4_;
              auVar81 = vdpps_avx(local_840._0_16_,local_730,0x7f);
              auVar82 = vfnmadd231ss_fma(auVar79,auVar80,ZEXT416((uint)fVar207));
              auVar81 = vfnmadd231ss_fma(auVar81,auVar80,auVar78);
              auVar79 = vpermilps_avx(local_5a0._0_16_,0xff);
              fVar210 = fVar210 - auVar79._0_4_;
              auVar77 = vshufps_avx(auVar76,auVar76,0xff);
              auVar79 = vfmsub213ss_fma(auVar82,ZEXT416((uint)fVar209),auVar77);
              auVar237._8_4_ = 0x80000000;
              auVar237._0_8_ = 0x8000000080000000;
              auVar237._12_4_ = 0x80000000;
              auVar239 = ZEXT1664(auVar237);
              auVar232._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar234 = ZEXT1664(auVar232);
              auVar81 = ZEXT416((uint)(auVar81._0_4_ * fVar209));
              auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar207),auVar81);
              auVar79 = vinsertps_avx(auVar232,auVar81,0x1c);
              auVar220._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar220._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar220._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar207),auVar220,0x10);
              auVar202._0_4_ = auVar82._0_4_;
              auVar202._4_4_ = auVar202._0_4_;
              auVar202._8_4_ = auVar202._0_4_;
              auVar202._12_4_ = auVar202._0_4_;
              auVar78 = vdivps_avx(auVar79,auVar202);
              auVar79 = vdivps_avx(auVar81,auVar202);
              auVar203._0_4_ = fVar208 * auVar78._0_4_ + fVar210 * auVar79._0_4_;
              auVar203._4_4_ = fVar208 * auVar78._4_4_ + fVar210 * auVar79._4_4_;
              auVar203._8_4_ = fVar208 * auVar78._8_4_ + fVar210 * auVar79._8_4_;
              auVar203._12_4_ = fVar208 * auVar78._12_4_ + fVar210 * auVar79._12_4_;
              auVar78 = vsubps_avx(local_6a0._0_16_,auVar203);
              auVar223 = ZEXT1664(auVar78);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(auVar80,auVar26);
            } while (auVar3._0_4_ <= auVar79._0_4_);
            auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar2._0_4_)),local_660,
                                      ZEXT416(0x36000000));
            auVar27._8_4_ = 0x7fffffff;
            auVar27._0_8_ = 0x7fffffff7fffffff;
            auVar27._12_4_ = 0x7fffffff;
            auVar80 = vandps_avx512vl(ZEXT416((uint)fVar210),auVar27);
          } while (auVar79._0_4_ <= auVar80._0_4_);
          fVar140 = auVar78._0_4_ + (float)local_670._0_4_;
          if ((fVar1 <= fVar140) && (fVar189 = *(float *)(ray + k * 4 + 0x80), fVar140 <= fVar189))
          {
            auVar79 = vmovshdup_avx(auVar78);
            fVar208 = auVar79._0_4_;
            if ((0.0 <= fVar208) && (fVar208 <= 1.0)) {
              auVar59._12_4_ = 0;
              auVar59._0_12_ = ZEXT412(0);
              auVar132._4_12_ = ZEXT412(0);
              auVar132._0_4_ = local_860._0_4_;
              auVar79 = vrsqrt14ss_avx512f(auVar59 << 0x20,auVar132._0_16_);
              fVar209 = auVar79._0_4_;
              auVar79 = vmulss_avx512f(local_860._0_16_,ZEXT416(0xbf000000));
              pGVar7 = (context->scene->geometries).items[uVar4].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar209 = fVar209 * 1.5 + auVar79._0_4_ * fVar209 * fVar209 * fVar209;
                auVar204._0_4_ = local_840._0_4_ * fVar209;
                auVar204._4_4_ = local_840._4_4_ * fVar209;
                auVar204._8_4_ = local_840._8_4_ * fVar209;
                auVar204._12_4_ = local_840._12_4_ * fVar209;
                auVar81 = vfmadd213ps_fma(auVar77,auVar204,auVar76);
                auVar79 = vshufps_avx(auVar204,auVar204,0xc9);
                auVar80 = vshufps_avx(auVar76,auVar76,0xc9);
                auVar205._0_4_ = auVar204._0_4_ * auVar80._0_4_;
                auVar205._4_4_ = auVar204._4_4_ * auVar80._4_4_;
                auVar205._8_4_ = auVar204._8_4_ * auVar80._8_4_;
                auVar205._12_4_ = auVar204._12_4_ * auVar80._12_4_;
                auVar80 = vfmsub231ps_fma(auVar205,auVar76,auVar79);
                auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                auVar76 = vshufps_avx(auVar81,auVar81,0xc9);
                auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                auVar146._0_4_ = auVar81._0_4_ * auVar80._0_4_;
                auVar146._4_4_ = auVar81._4_4_ * auVar80._4_4_;
                auVar146._8_4_ = auVar81._8_4_ * auVar80._8_4_;
                auVar146._12_4_ = auVar81._12_4_ * auVar80._12_4_;
                auVar79 = vfmsub231ps_fma(auVar146,auVar79,auVar76);
                uVar155 = auVar79._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar140;
                  uVar6 = vextractps_avx(auVar79,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
                  uVar6 = vextractps_avx(auVar79,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar155;
                  *(float *)(ray + k * 4 + 0xf0) = fVar208;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = uVar5;
                  *(uint *)(ray + k * 4 + 0x120) = uVar4;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_510 = vshufps_avx(auVar78,auVar78,0x55);
                  local_540 = (RTCHitN  [16])vshufps_avx(auVar79,auVar79,0x55);
                  auStack_530 = vshufps_avx(auVar79,auVar79,0xaa);
                  local_520 = uVar155;
                  uStack_51c = uVar155;
                  uStack_518 = uVar155;
                  uStack_514 = uVar155;
                  local_500 = ZEXT416(0) << 0x20;
                  local_4f0 = local_560._0_8_;
                  uStack_4e8 = local_560._8_8_;
                  local_4e0 = local_550;
                  vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                  uStack_4cc = context->user->instID[0];
                  local_4d0 = uStack_4cc;
                  uStack_4c8 = uStack_4cc;
                  uStack_4c4 = uStack_4cc;
                  uStack_4c0 = context->user->instPrimID[0];
                  uStack_4bc = uStack_4c0;
                  uStack_4b8 = uStack_4c0;
                  uStack_4b4 = uStack_4c0;
                  *(float *)(ray + k * 4 + 0x80) = fVar140;
                  local_8c0 = local_570;
                  local_810.valid = (int *)local_8c0;
                  local_810.geometryUserPtr = pGVar7->userPtr;
                  local_810.context = context->user;
                  local_810.hit = local_540;
                  local_810.N = 4;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar234 = ZEXT1664(auVar232);
                    auVar239 = ZEXT1664(auVar237);
                    auVar244 = ZEXT1664(local_840._0_16_);
                    auVar245 = ZEXT1664(ZEXT416((uint)fVar207));
                    (*pGVar7->intersectionFilterN)(&local_810);
                    auVar253 = ZEXT3264(local_8a0);
                    auVar252 = ZEXT3264(local_880);
                  }
                  uVar74 = vptestmd_avx512vl(local_8c0,local_8c0);
                  if ((uVar74 & 0xf) != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      auVar239 = ZEXT1664(auVar239._0_16_);
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      (*p_Var8)(&local_810);
                      auVar253 = ZEXT3264(local_8a0);
                      auVar252 = ZEXT3264(local_880);
                    }
                    uVar74 = vptestmd_avx512vl(local_8c0,local_8c0);
                    uVar74 = uVar74 & 0xf;
                    bVar68 = (byte)uVar74;
                    if (bVar68 != 0) {
                      iVar60 = *(int *)(local_810.hit + 4);
                      iVar61 = *(int *)(local_810.hit + 8);
                      iVar62 = *(int *)(local_810.hit + 0xc);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0xc0) =
                           (uint)(bVar68 & 1) * *(int *)local_810.hit |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_810.ray + 0xc0);
                      *(uint *)(local_810.ray + 0xc4) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0xc4);
                      *(uint *)(local_810.ray + 200) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 200);
                      *(uint *)(local_810.ray + 0xcc) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0xcc);
                      iVar60 = *(int *)(local_810.hit + 0x14);
                      iVar61 = *(int *)(local_810.hit + 0x18);
                      iVar62 = *(int *)(local_810.hit + 0x1c);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0xd0) =
                           (uint)(bVar68 & 1) * *(int *)(local_810.hit + 0x10) |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_810.ray + 0xd0);
                      *(uint *)(local_810.ray + 0xd4) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0xd4);
                      *(uint *)(local_810.ray + 0xd8) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 0xd8);
                      *(uint *)(local_810.ray + 0xdc) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0xdc);
                      iVar60 = *(int *)(local_810.hit + 0x24);
                      iVar61 = *(int *)(local_810.hit + 0x28);
                      iVar62 = *(int *)(local_810.hit + 0x2c);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0xe0) =
                           (uint)(bVar68 & 1) * *(int *)(local_810.hit + 0x20) |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_810.ray + 0xe0);
                      *(uint *)(local_810.ray + 0xe4) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0xe4);
                      *(uint *)(local_810.ray + 0xe8) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 0xe8);
                      *(uint *)(local_810.ray + 0xec) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0xec);
                      iVar60 = *(int *)(local_810.hit + 0x34);
                      iVar61 = *(int *)(local_810.hit + 0x38);
                      iVar62 = *(int *)(local_810.hit + 0x3c);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0xf0) =
                           (uint)(bVar68 & 1) * *(int *)(local_810.hit + 0x30) |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_810.ray + 0xf0);
                      *(uint *)(local_810.ray + 0xf4) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0xf4);
                      *(uint *)(local_810.ray + 0xf8) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 0xf8);
                      *(uint *)(local_810.ray + 0xfc) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0xfc);
                      iVar60 = *(int *)(local_810.hit + 0x44);
                      iVar61 = *(int *)(local_810.hit + 0x48);
                      iVar62 = *(int *)(local_810.hit + 0x4c);
                      bVar73 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)(bVar68 & 1) * *(int *)(local_810.hit + 0x40) |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar73 * iVar60 | (uint)!bVar73 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_810.ray + 0x10c);
                      auVar78 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar78;
                      auVar78 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar78;
                      auVar78 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar78;
                      auVar78 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar78;
                      goto LAB_01a3f556;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar189;
                }
              }
            }
          }
LAB_01a3f556:
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar222._4_4_ = uVar155;
          auVar222._0_4_ = uVar155;
          auVar222._8_4_ = uVar155;
          auVar222._12_4_ = uVar155;
          auVar222._16_4_ = uVar155;
          auVar222._20_4_ = uVar155;
          auVar222._24_4_ = uVar155;
          auVar222._28_4_ = uVar155;
          auVar223 = ZEXT3264(auVar222);
          auVar64._4_4_ = fStack_41c;
          auVar64._0_4_ = local_420;
          auVar64._8_4_ = fStack_418;
          auVar64._12_4_ = fStack_414;
          auVar64._16_4_ = fStack_410;
          auVar64._20_4_ = fStack_40c;
          auVar64._24_4_ = fStack_408;
          auVar64._28_4_ = fStack_404;
          uVar16 = vcmpps_avx512vl(auVar222,auVar64,0xd);
        }
        uVar18 = vpcmpd_avx512vl(local_3e0,local_360,1);
        uVar17 = vpcmpd_avx512vl(local_3e0,_local_440,1);
        auVar171._0_4_ = (float)local_460._0_4_ + (float)local_200._0_4_;
        auVar171._4_4_ = (float)local_460._4_4_ + (float)local_200._4_4_;
        auVar171._8_4_ = fStack_458 + fStack_1f8;
        auVar171._12_4_ = fStack_454 + fStack_1f4;
        auVar171._16_4_ = fStack_450 + fStack_1f0;
        auVar171._20_4_ = fStack_44c + fStack_1ec;
        auVar171._24_4_ = fStack_448 + fStack_1e8;
        auVar171._28_4_ = fStack_444 + fStack_1e4;
        uVar155 = auVar223._0_4_;
        auVar187._4_4_ = uVar155;
        auVar187._0_4_ = uVar155;
        auVar187._8_4_ = uVar155;
        auVar187._12_4_ = uVar155;
        auVar187._16_4_ = uVar155;
        auVar187._20_4_ = uVar155;
        auVar187._24_4_ = uVar155;
        auVar187._28_4_ = uVar155;
        uVar16 = vcmpps_avx512vl(auVar171,auVar187,2);
        bVar70 = (byte)local_8ac & (byte)uVar18 & (byte)uVar16;
        auVar206._0_4_ = (float)local_460._0_4_ + (float)local_3a0._0_4_;
        auVar206._4_4_ = (float)local_460._4_4_ + (float)local_3a0._4_4_;
        auVar206._8_4_ = fStack_458 + fStack_398;
        auVar206._12_4_ = fStack_454 + fStack_394;
        auVar206._16_4_ = fStack_450 + fStack_390;
        auVar206._20_4_ = fStack_44c + fStack_38c;
        auVar206._24_4_ = fStack_448 + fStack_388;
        auVar206._28_4_ = fStack_444 + fStack_384;
        uVar16 = vcmpps_avx512vl(auVar206,auVar187,2);
        bVar66 = bVar66 & (byte)uVar17 & (byte)uVar16 | bVar70;
        if (bVar66 != 0) {
          abStack_180[uVar69 * 0x60] = bVar66;
          bVar73 = (bool)(bVar70 >> 1 & 1);
          bVar9 = (bool)(bVar70 >> 2 & 1);
          bVar10 = (bool)(bVar70 >> 3 & 1);
          bVar11 = (bool)(bVar70 >> 4 & 1);
          bVar12 = (bool)(bVar70 >> 5 & 1);
          bVar13 = (bool)(bVar70 >> 6 & 1);
          auStack_160[uVar69 * 0x18] =
               (uint)(bVar70 & 1) * local_200._0_4_ | (uint)!(bool)(bVar70 & 1) * local_3a0._0_4_;
          auStack_160[uVar69 * 0x18 + 1] =
               (uint)bVar73 * local_200._4_4_ | (uint)!bVar73 * local_3a0._4_4_;
          auStack_160[uVar69 * 0x18 + 2] =
               (uint)bVar9 * (int)fStack_1f8 | (uint)!bVar9 * (int)fStack_398;
          auStack_160[uVar69 * 0x18 + 3] =
               (uint)bVar10 * (int)fStack_1f4 | (uint)!bVar10 * (int)fStack_394;
          auStack_160[uVar69 * 0x18 + 4] =
               (uint)bVar11 * (int)fStack_1f0 | (uint)!bVar11 * (int)fStack_390;
          auStack_160[uVar69 * 0x18 + 5] =
               (uint)bVar12 * (int)fStack_1ec | (uint)!bVar12 * (int)fStack_38c;
          auStack_160[uVar69 * 0x18 + 6] =
               (uint)bVar13 * (int)fStack_1e8 | (uint)!bVar13 * (int)fStack_388;
          auStack_160[uVar69 * 0x18 + 7] =
               (uint)(bVar70 >> 7) * (int)fStack_1e4 | (uint)!(bool)(bVar70 >> 7) * (int)fStack_384;
          uVar74 = vmovlps_avx(local_3f0);
          (&uStack_140)[uVar69 * 0xc] = uVar74;
          aiStack_138[uVar69 * 0x18] = local_a64 + 1;
          uVar69 = (ulong)((int)uVar69 + 1);
        }
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar254 = ZEXT3264(auVar97);
        auVar223 = ZEXT3264(_DAT_01f7b040);
        prim = local_790;
      }
    }
    do {
      uVar75 = (uint)uVar69;
      uVar69 = (ulong)(uVar75 - 1);
      if (uVar75 == 0) {
        uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar34._4_4_ = uVar155;
        auVar34._0_4_ = uVar155;
        auVar34._8_4_ = uVar155;
        auVar34._12_4_ = uVar155;
        auVar34._16_4_ = uVar155;
        auVar34._20_4_ = uVar155;
        auVar34._24_4_ = uVar155;
        auVar34._28_4_ = uVar155;
        uVar16 = vcmpps_avx512vl(local_340,auVar34,2);
        local_788 = (ulong)((uint)local_788 & (uint)uVar16);
        goto LAB_01a3ce02;
      }
      auVar97 = *(undefined1 (*) [32])(auStack_160 + uVar69 * 0x18);
      auVar168._0_4_ = auVar97._0_4_ + (float)local_460._0_4_;
      auVar168._4_4_ = auVar97._4_4_ + (float)local_460._4_4_;
      auVar168._8_4_ = auVar97._8_4_ + fStack_458;
      auVar168._12_4_ = auVar97._12_4_ + fStack_454;
      auVar168._16_4_ = auVar97._16_4_ + fStack_450;
      auVar168._20_4_ = auVar97._20_4_ + fStack_44c;
      auVar168._24_4_ = auVar97._24_4_ + fStack_448;
      auVar168._28_4_ = auVar97._28_4_ + fStack_444;
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar33._4_4_ = uVar155;
      auVar33._0_4_ = uVar155;
      auVar33._8_4_ = uVar155;
      auVar33._12_4_ = uVar155;
      auVar33._16_4_ = uVar155;
      auVar33._20_4_ = uVar155;
      auVar33._24_4_ = uVar155;
      auVar33._28_4_ = uVar155;
      uVar16 = vcmpps_avx512vl(auVar168,auVar33,2);
      uVar133 = (uint)uVar16 & (uint)abStack_180[uVar69 * 0x60];
    } while (uVar133 == 0);
    uVar74 = (&uStack_140)[uVar69 * 0xc];
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar74;
    auVar186._8_4_ = 0x7f800000;
    auVar186._0_8_ = 0x7f8000007f800000;
    auVar186._12_4_ = 0x7f800000;
    auVar186._16_4_ = 0x7f800000;
    auVar186._20_4_ = 0x7f800000;
    auVar186._24_4_ = 0x7f800000;
    auVar186._28_4_ = 0x7f800000;
    auVar86 = vblendmps_avx512vl(auVar186,auVar97);
    bVar66 = (byte)uVar133;
    auVar128._0_4_ =
         (uint)(bVar66 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar66 & 1) * (int)auVar97._0_4_;
    bVar73 = (bool)((byte)(uVar133 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar73 * auVar86._4_4_ | (uint)!bVar73 * (int)auVar97._4_4_;
    bVar73 = (bool)((byte)(uVar133 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar73 * auVar86._8_4_ | (uint)!bVar73 * (int)auVar97._8_4_;
    bVar73 = (bool)((byte)(uVar133 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar73 * auVar86._12_4_ | (uint)!bVar73 * (int)auVar97._12_4_;
    bVar73 = (bool)((byte)(uVar133 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar73 * auVar86._16_4_ | (uint)!bVar73 * (int)auVar97._16_4_;
    bVar73 = (bool)((byte)(uVar133 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar73 * auVar86._20_4_ | (uint)!bVar73 * (int)auVar97._20_4_;
    bVar73 = (bool)((byte)(uVar133 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar73 * auVar86._24_4_ | (uint)!bVar73 * (int)auVar97._24_4_;
    auVar128._28_4_ =
         (uVar133 >> 7) * auVar86._28_4_ | (uint)!SUB41(uVar133 >> 7,0) * (int)auVar97._28_4_;
    auVar97 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar97 = vminps_avx(auVar128,auVar97);
    auVar86 = vshufpd_avx(auVar97,auVar97,5);
    auVar97 = vminps_avx(auVar97,auVar86);
    auVar86 = vpermpd_avx2(auVar97,0x4e);
    auVar97 = vminps_avx(auVar97,auVar86);
    uVar16 = vcmpps_avx512vl(auVar128,auVar97,0);
    bVar70 = (byte)uVar16 & bVar66;
    if (bVar70 != 0) {
      uVar133 = (uint)bVar70;
    }
    uVar134 = 0;
    for (; (uVar133 & 1) == 0; uVar133 = uVar133 >> 1 | 0x80000000) {
      uVar134 = uVar134 + 1;
    }
    local_a64 = aiStack_138[uVar69 * 0x18];
    bVar66 = ~('\x01' << ((byte)uVar134 & 0x1f)) & bVar66;
    abStack_180[uVar69 * 0x60] = bVar66;
    if (bVar66 == 0) {
      uVar75 = uVar75 - 1;
    }
    uVar155 = (undefined4)uVar74;
    auVar149._4_4_ = uVar155;
    auVar149._0_4_ = uVar155;
    auVar149._8_4_ = uVar155;
    auVar149._12_4_ = uVar155;
    auVar149._16_4_ = uVar155;
    auVar149._20_4_ = uVar155;
    auVar149._24_4_ = uVar155;
    auVar149._28_4_ = uVar155;
    auVar78 = vmovshdup_avx(auVar156);
    auVar78 = vsubps_avx(auVar78,auVar156);
    auVar169._0_4_ = auVar78._0_4_;
    auVar169._4_4_ = auVar169._0_4_;
    auVar169._8_4_ = auVar169._0_4_;
    auVar169._12_4_ = auVar169._0_4_;
    auVar169._16_4_ = auVar169._0_4_;
    auVar169._20_4_ = auVar169._0_4_;
    auVar169._24_4_ = auVar169._0_4_;
    auVar169._28_4_ = auVar169._0_4_;
    auVar78 = vfmadd132ps_fma(auVar169,auVar149,auVar223._0_32_);
    _local_540 = ZEXT1632(auVar78);
    local_3f0._8_8_ = 0;
    local_3f0._0_8_ = *(ulong *)(local_540 + (ulong)uVar134 * 4);
    uVar69 = (ulong)uVar75;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }